

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Primitive PVar20;
  int iVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  undefined1 auVar25 [16];
  RTCFeatureFlags RVar26;
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  int iVar55;
  undefined4 uVar56;
  ulong uVar57;
  RTCFilterFunctionN p_Var58;
  RayHitK<4> *pRVar59;
  RTCIntersectArguments *pRVar60;
  RTCIntersectArguments *pRVar62;
  ulong uVar63;
  RTCIntersectArguments *pRVar64;
  Geometry *pGVar65;
  long lVar66;
  long lVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  short sVar76;
  undefined2 uVar112;
  float fVar77;
  float fVar78;
  float fVar113;
  float fVar115;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar114;
  float fVar116;
  undefined8 uVar117;
  float fVar118;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar119;
  float fVar120;
  float fVar153;
  float fVar155;
  vfloat4 v_2;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar154;
  float fVar156;
  float fVar157;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar158;
  float fVar169;
  float fVar171;
  vfloat4 v;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar159;
  float fVar170;
  float fVar172;
  float fVar173;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar174;
  float fVar190;
  float fVar191;
  vfloat4 v_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar192;
  float fVar200;
  float fVar201;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar224;
  float fVar226;
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar229;
  float fVar233;
  float fVar234;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar242;
  float fVar243;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar244;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar277;
  float fVar278;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar288;
  float fVar289;
  float fVar298;
  float fVar300;
  float fVar302;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar304;
  float fVar305;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar314;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_508 [8];
  float fStack_500;
  undefined4 uStack_4fc;
  undefined8 local_4f8;
  undefined4 uStack_4cc;
  float local_478;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  Precalculations *local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  RTCFilterFunctionNArguments local_318;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 (*local_2c8) [16];
  RayHitK<4> *local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  LinearSpace3fa *local_218;
  Primitive *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  uint local_1d8;
  int local_1d4;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  float local_178 [4];
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [4];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [12];
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar61;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 uVar111;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  
  PVar20 = prim[1];
  uVar57 = (ulong)(byte)PVar20;
  lVar24 = uVar57 * 0x25;
  pPVar7 = prim + lVar24 + 6;
  fVar171 = *(float *)(pPVar7 + 0xc);
  fVar174 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar171;
  fVar190 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar171;
  fVar191 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar171;
  fVar158 = *(float *)(ray + k * 4 + 0x40) * fVar171;
  fVar169 = *(float *)(ray + k * 4 + 0x50) * fVar171;
  fVar171 = *(float *)(ray + k * 4 + 0x60) * fVar171;
  uVar56 = *(undefined4 *)(prim + uVar57 * 4 + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar257._8_4_ = 0;
  auVar257._0_8_ = uVar61;
  auVar257._12_2_ = uVar112;
  auVar257._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar161._12_4_ = auVar257._12_4_;
  auVar161._8_2_ = 0;
  auVar161._0_8_ = uVar61;
  auVar161._10_2_ = uVar112;
  auVar79._10_6_ = auVar161._10_6_;
  auVar79._8_2_ = uVar112;
  auVar79._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar29._4_8_ = auVar79._8_8_;
  auVar29._2_2_ = uVar112;
  auVar29._0_2_ = uVar112;
  fVar304 = (float)((int)sVar76 >> 8);
  fVar311 = (float)(auVar29._0_4_ >> 0x18);
  fVar312 = (float)(auVar79._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 5 + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar61;
  auVar123._12_2_ = uVar112;
  auVar123._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar61;
  auVar122._10_2_ = uVar112;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar112;
  auVar121._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar30._4_8_ = auVar121._8_8_;
  auVar30._2_2_ = uVar112;
  auVar30._0_2_ = uVar112;
  fVar192 = (float)((int)sVar76 >> 8);
  fVar200 = (float)(auVar30._0_4_ >> 0x18);
  fVar201 = (float)(auVar121._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 6 + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar61;
  auVar126._12_2_ = uVar112;
  auVar126._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar61;
  auVar125._10_2_ = uVar112;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._8_2_ = uVar112;
  auVar124._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar31._4_8_ = auVar124._8_8_;
  auVar31._2_2_ = uVar112;
  auVar31._0_2_ = uVar112;
  fVar229 = (float)((int)sVar76 >> 8);
  fVar233 = (float)(auVar31._0_4_ >> 0x18);
  fVar234 = (float)(auVar124._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0xf + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar61;
  auVar129._12_2_ = uVar112;
  auVar129._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar61;
  auVar128._10_2_ = uVar112;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._8_2_ = uVar112;
  auVar127._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar32._4_8_ = auVar127._8_8_;
  auVar32._2_2_ = uVar112;
  auVar32._0_2_ = uVar112;
  fVar77 = (float)((int)sVar76 >> 8);
  fVar113 = (float)(auVar32._0_4_ >> 0x18);
  fVar115 = (float)(auVar127._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar61;
  auVar205._12_2_ = uVar112;
  auVar205._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar61;
  auVar204._10_2_ = uVar112;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar112;
  auVar203._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar33._4_8_ = auVar203._8_8_;
  auVar33._2_2_ = uVar112;
  auVar33._0_2_ = uVar112;
  fVar235 = (float)((int)sVar76 >> 8);
  fVar242 = (float)(auVar33._0_4_ >> 0x18);
  fVar243 = (float)(auVar203._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + uVar57 + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar61;
  auVar208._12_2_ = uVar112;
  auVar208._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar61;
  auVar207._10_2_ = uVar112;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar112;
  auVar206._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar34._4_8_ = auVar206._8_8_;
  auVar34._2_2_ = uVar112;
  auVar34._0_2_ = uVar112;
  fVar251 = (float)((int)sVar76 >> 8);
  fVar259 = (float)(auVar34._0_4_ >> 0x18);
  fVar261 = (float)(auVar206._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0x1a + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar61;
  auVar211._12_2_ = uVar112;
  auVar211._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar61;
  auVar210._10_2_ = uVar112;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar112;
  auVar209._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar35._4_8_ = auVar209._8_8_;
  auVar35._2_2_ = uVar112;
  auVar35._0_2_ = uVar112;
  fVar244 = (float)((int)sVar76 >> 8);
  fVar247 = (float)(auVar35._0_4_ >> 0x18);
  fVar248 = (float)(auVar209._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0x1b + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar61;
  auVar214._12_2_ = uVar112;
  auVar214._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar61;
  auVar213._10_2_ = uVar112;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar112;
  auVar212._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar36._4_8_ = auVar212._8_8_;
  auVar36._2_2_ = uVar112;
  auVar36._0_2_ = uVar112;
  fVar264 = (float)((int)sVar76 >> 8);
  fVar273 = (float)(auVar36._0_4_ >> 0x18);
  fVar275 = (float)(auVar212._8_4_ >> 0x18);
  uVar56 = *(undefined4 *)(prim + uVar57 * 0x1c + 6);
  uVar111 = (undefined1)((uint)uVar56 >> 0x18);
  uVar112 = CONCAT11(uVar111,uVar111);
  uVar111 = (undefined1)((uint)uVar56 >> 0x10);
  uVar117 = CONCAT35(CONCAT21(uVar112,uVar111),CONCAT14(uVar111,uVar56));
  uVar111 = (undefined1)((uint)uVar56 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar117 >> 0x20),uVar111),uVar111);
  sVar76 = CONCAT11((char)uVar56,(char)uVar56);
  uVar61 = CONCAT62(uVar28,sVar76);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar61;
  auVar217._12_2_ = uVar112;
  auVar217._14_2_ = uVar112;
  uVar112 = (undefined2)((ulong)uVar117 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar61;
  auVar216._10_2_ = uVar112;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar112;
  auVar215._0_8_ = uVar61;
  uVar112 = (undefined2)uVar28;
  auVar37._4_8_ = auVar215._8_8_;
  auVar37._2_2_ = uVar112;
  auVar37._0_2_ = uVar112;
  fVar119 = (float)((int)sVar76 >> 8);
  fVar153 = (float)(auVar37._0_4_ >> 0x18);
  fVar155 = (float)(auVar215._8_4_ >> 0x18);
  fVar288 = fVar158 * fVar304 + fVar169 * fVar192 + fVar171 * fVar229;
  fVar298 = fVar158 * fVar311 + fVar169 * fVar200 + fVar171 * fVar233;
  fVar300 = fVar158 * fVar312 + fVar169 * fVar201 + fVar171 * fVar234;
  fVar302 = fVar158 * (float)(auVar161._12_4_ >> 0x18) +
            fVar169 * (float)(auVar122._12_4_ >> 0x18) + fVar171 * (float)(auVar125._12_4_ >> 0x18);
  fVar278 = fVar158 * fVar77 + fVar169 * fVar235 + fVar171 * fVar251;
  fVar285 = fVar158 * fVar113 + fVar169 * fVar242 + fVar171 * fVar259;
  fVar286 = fVar158 * fVar115 + fVar169 * fVar243 + fVar171 * fVar261;
  fVar287 = fVar158 * (float)(auVar128._12_4_ >> 0x18) +
            fVar169 * (float)(auVar204._12_4_ >> 0x18) + fVar171 * (float)(auVar207._12_4_ >> 0x18);
  fVar202 = fVar158 * fVar244 + fVar169 * fVar264 + fVar171 * fVar119;
  fVar224 = fVar158 * fVar247 + fVar169 * fVar273 + fVar171 * fVar153;
  fVar226 = fVar158 * fVar248 + fVar169 * fVar275 + fVar171 * fVar155;
  fVar158 = fVar158 * (float)(auVar210._12_4_ >> 0x18) +
            fVar169 * (float)(auVar213._12_4_ >> 0x18) + fVar171 * (float)(auVar216._12_4_ >> 0x18);
  fVar305 = fVar304 * fVar174 + fVar192 * fVar190 + fVar229 * fVar191;
  fVar311 = fVar311 * fVar174 + fVar200 * fVar190 + fVar233 * fVar191;
  fVar312 = fVar312 * fVar174 + fVar201 * fVar190 + fVar234 * fVar191;
  fVar313 = (float)(auVar161._12_4_ >> 0x18) * fVar174 +
            (float)(auVar122._12_4_ >> 0x18) * fVar190 + (float)(auVar125._12_4_ >> 0x18) * fVar191;
  fVar251 = fVar77 * fVar174 + fVar235 * fVar190 + fVar251 * fVar191;
  fVar259 = fVar113 * fVar174 + fVar242 * fVar190 + fVar259 * fVar191;
  fVar261 = fVar115 * fVar174 + fVar243 * fVar190 + fVar261 * fVar191;
  fVar304 = (float)(auVar128._12_4_ >> 0x18) * fVar174 +
            (float)(auVar204._12_4_ >> 0x18) * fVar190 + (float)(auVar207._12_4_ >> 0x18) * fVar191;
  fVar244 = fVar174 * fVar244 + fVar190 * fVar264 + fVar191 * fVar119;
  fVar247 = fVar174 * fVar247 + fVar190 * fVar273 + fVar191 * fVar153;
  fVar248 = fVar174 * fVar248 + fVar190 * fVar275 + fVar191 * fVar155;
  fVar264 = fVar174 * (float)(auVar210._12_4_ >> 0x18) +
            fVar190 * (float)(auVar213._12_4_ >> 0x18) + fVar191 * (float)(auVar216._12_4_ >> 0x18);
  fVar171 = (float)DAT_01f80d30;
  fVar77 = DAT_01f80d30._4_4_;
  fVar113 = DAT_01f80d30._8_4_;
  fVar115 = DAT_01f80d30._12_4_;
  uVar68 = -(uint)(fVar171 <= ABS(fVar288));
  uVar69 = -(uint)(fVar77 <= ABS(fVar298));
  uVar71 = -(uint)(fVar113 <= ABS(fVar300));
  uVar73 = -(uint)(fVar115 <= ABS(fVar302));
  auVar290._0_4_ = (uint)fVar288 & uVar68;
  auVar290._4_4_ = (uint)fVar298 & uVar69;
  auVar290._8_4_ = (uint)fVar300 & uVar71;
  auVar290._12_4_ = (uint)fVar302 & uVar73;
  auVar175._0_4_ = ~uVar68 & (uint)fVar171;
  auVar175._4_4_ = ~uVar69 & (uint)fVar77;
  auVar175._8_4_ = ~uVar71 & (uint)fVar113;
  auVar175._12_4_ = ~uVar73 & (uint)fVar115;
  auVar175 = auVar175 | auVar290;
  uVar68 = -(uint)(fVar171 <= ABS(fVar278));
  uVar69 = -(uint)(fVar77 <= ABS(fVar285));
  uVar71 = -(uint)(fVar113 <= ABS(fVar286));
  uVar73 = -(uint)(fVar115 <= ABS(fVar287));
  auVar279._0_4_ = (uint)fVar278 & uVar68;
  auVar279._4_4_ = (uint)fVar285 & uVar69;
  auVar279._8_4_ = (uint)fVar286 & uVar71;
  auVar279._12_4_ = (uint)fVar287 & uVar73;
  auVar230._0_4_ = ~uVar68 & (uint)fVar171;
  auVar230._4_4_ = ~uVar69 & (uint)fVar77;
  auVar230._8_4_ = ~uVar71 & (uint)fVar113;
  auVar230._12_4_ = ~uVar73 & (uint)fVar115;
  auVar230 = auVar230 | auVar279;
  uVar68 = -(uint)(fVar171 <= ABS(fVar202));
  uVar69 = -(uint)(fVar77 <= ABS(fVar224));
  uVar71 = -(uint)(fVar113 <= ABS(fVar226));
  uVar73 = -(uint)(fVar115 <= ABS(fVar158));
  auVar218._0_4_ = (uint)fVar202 & uVar68;
  auVar218._4_4_ = (uint)fVar224 & uVar69;
  auVar218._8_4_ = (uint)fVar226 & uVar71;
  auVar218._12_4_ = (uint)fVar158 & uVar73;
  auVar236._0_4_ = ~uVar68 & (uint)fVar171;
  auVar236._4_4_ = ~uVar69 & (uint)fVar77;
  auVar236._8_4_ = ~uVar71 & (uint)fVar113;
  auVar236._12_4_ = ~uVar73 & (uint)fVar115;
  auVar236 = auVar236 | auVar218;
  auVar79 = rcpps(_DAT_01f80d30,auVar175);
  fVar171 = auVar79._0_4_;
  fVar115 = auVar79._4_4_;
  fVar192 = auVar79._8_4_;
  fVar235 = auVar79._12_4_;
  fVar171 = (1.0 - auVar175._0_4_ * fVar171) * fVar171 + fVar171;
  fVar115 = (1.0 - auVar175._4_4_ * fVar115) * fVar115 + fVar115;
  fVar192 = (1.0 - auVar175._8_4_ * fVar192) * fVar192 + fVar192;
  fVar235 = (1.0 - auVar175._12_4_ * fVar235) * fVar235 + fVar235;
  auVar79 = rcpps(auVar79,auVar230);
  fVar77 = auVar79._0_4_;
  fVar119 = auVar79._4_4_;
  fVar200 = auVar79._8_4_;
  fVar242 = auVar79._12_4_;
  fVar77 = (1.0 - auVar230._0_4_ * fVar77) * fVar77 + fVar77;
  fVar119 = (1.0 - auVar230._4_4_ * fVar119) * fVar119 + fVar119;
  fVar200 = (1.0 - auVar230._8_4_ * fVar200) * fVar200 + fVar200;
  fVar242 = (1.0 - auVar230._12_4_ * fVar242) * fVar242 + fVar242;
  auVar79 = rcpps(auVar79,auVar236);
  fVar113 = auVar79._0_4_;
  fVar153 = auVar79._4_4_;
  fVar201 = auVar79._8_4_;
  fVar243 = auVar79._12_4_;
  fVar113 = (1.0 - auVar236._0_4_ * fVar113) * fVar113 + fVar113;
  fVar153 = (1.0 - auVar236._4_4_ * fVar153) * fVar153 + fVar153;
  fVar201 = (1.0 - auVar236._8_4_ * fVar201) * fVar201 + fVar201;
  fVar243 = (1.0 - auVar236._12_4_ * fVar243) * fVar243 + fVar243;
  fVar273 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  uVar61 = *(ulong *)(prim + uVar57 * 7 + 6);
  uVar112 = (undefined2)(uVar61 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar61;
  auVar82._12_2_ = uVar112;
  auVar82._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar61 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar61;
  auVar81._10_2_ = uVar112;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar112;
  auVar80._0_8_ = uVar61;
  uVar112 = (undefined2)(uVar61 >> 0x10);
  auVar38._4_8_ = auVar80._8_8_;
  auVar38._2_2_ = uVar112;
  auVar38._0_2_ = uVar112;
  fVar155 = (float)(auVar38._0_4_ >> 0x10);
  fVar202 = (float)(auVar80._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar57 * 0xb + 6);
  uVar112 = (undefined2)(uVar9 >> 0x30);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar9;
  auVar178._12_2_ = uVar112;
  auVar178._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar9 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar9;
  auVar177._10_2_ = uVar112;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar112;
  auVar176._0_8_ = uVar9;
  uVar112 = (undefined2)(uVar9 >> 0x10);
  auVar39._4_8_ = auVar176._8_8_;
  auVar39._2_2_ = uVar112;
  auVar39._0_2_ = uVar112;
  uVar10 = *(ulong *)(prim + uVar57 * 9 + 6);
  uVar112 = (undefined2)(uVar10 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar10;
  auVar85._12_2_ = uVar112;
  auVar85._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar10 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar10;
  auVar84._10_2_ = uVar112;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar112;
  auVar83._0_8_ = uVar10;
  uVar112 = (undefined2)(uVar10 >> 0x10);
  auVar40._4_8_ = auVar83._8_8_;
  auVar40._2_2_ = uVar112;
  auVar40._0_2_ = uVar112;
  fVar158 = (float)(auVar40._0_4_ >> 0x10);
  fVar224 = (float)(auVar83._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar57 * 0xd + 6);
  uVar112 = (undefined2)(uVar11 >> 0x30);
  auVar239._8_4_ = 0;
  auVar239._0_8_ = uVar11;
  auVar239._12_2_ = uVar112;
  auVar239._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar11 >> 0x20);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._8_2_ = 0;
  auVar238._0_8_ = uVar11;
  auVar238._10_2_ = uVar112;
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._8_2_ = uVar112;
  auVar237._0_8_ = uVar11;
  uVar112 = (undefined2)(uVar11 >> 0x10);
  auVar41._4_8_ = auVar237._8_8_;
  auVar41._2_2_ = uVar112;
  auVar41._0_2_ = uVar112;
  uVar12 = *(ulong *)(prim + uVar57 * 0x12 + 6);
  uVar112 = (undefined2)(uVar12 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar12;
  auVar88._12_2_ = uVar112;
  auVar88._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar12 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar12;
  auVar87._10_2_ = uVar112;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar112;
  auVar86._0_8_ = uVar12;
  uVar112 = (undefined2)(uVar12 >> 0x10);
  auVar42._4_8_ = auVar86._8_8_;
  auVar42._2_2_ = uVar112;
  auVar42._0_2_ = uVar112;
  fVar169 = (float)(auVar42._0_4_ >> 0x10);
  fVar226 = (float)(auVar86._8_4_ >> 0x10);
  uVar63 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar57 * 2 + uVar63 + 6);
  uVar112 = (undefined2)(uVar13 >> 0x30);
  auVar255._8_4_ = 0;
  auVar255._0_8_ = uVar13;
  auVar255._12_2_ = uVar112;
  auVar255._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar13 >> 0x20);
  auVar254._12_4_ = auVar255._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar13;
  auVar254._10_2_ = uVar112;
  auVar253._10_6_ = auVar254._10_6_;
  auVar253._8_2_ = uVar112;
  auVar253._0_8_ = uVar13;
  uVar112 = (undefined2)(uVar13 >> 0x10);
  auVar43._4_8_ = auVar253._8_8_;
  auVar43._2_2_ = uVar112;
  auVar43._0_2_ = uVar112;
  uVar63 = *(ulong *)(prim + uVar63 + 6);
  uVar112 = (undefined2)(uVar63 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar63;
  auVar91._12_2_ = uVar112;
  auVar91._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar63 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar63;
  auVar90._10_2_ = uVar112;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar112;
  auVar89._0_8_ = uVar63;
  uVar112 = (undefined2)(uVar63 >> 0x10);
  auVar44._4_8_ = auVar89._8_8_;
  auVar44._2_2_ = uVar112;
  auVar44._0_2_ = uVar112;
  fVar174 = (float)(auVar44._0_4_ >> 0x10);
  fVar229 = (float)(auVar89._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar57 * 0x18 + 6);
  uVar112 = (undefined2)(uVar14 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar14;
  auVar268._12_2_ = uVar112;
  auVar268._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar14 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar14;
  auVar267._10_2_ = uVar112;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar112;
  auVar266._0_8_ = uVar14;
  uVar112 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar266._8_8_;
  auVar45._2_2_ = uVar112;
  auVar45._0_2_ = uVar112;
  uVar15 = *(ulong *)(prim + uVar57 * 0x1d + 6);
  uVar112 = (undefined2)(uVar15 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar15;
  auVar94._12_2_ = uVar112;
  auVar94._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar15 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar15;
  auVar93._10_2_ = uVar112;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar112;
  auVar92._0_8_ = uVar15;
  uVar112 = (undefined2)(uVar15 >> 0x10);
  auVar46._4_8_ = auVar92._8_8_;
  auVar46._2_2_ = uVar112;
  auVar46._0_2_ = uVar112;
  fVar190 = (float)(auVar46._0_4_ >> 0x10);
  fVar233 = (float)(auVar92._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar57 + (ulong)(byte)PVar20 * 0x20 + 6);
  uVar112 = (undefined2)(uVar16 >> 0x30);
  auVar282._8_4_ = 0;
  auVar282._0_8_ = uVar16;
  auVar282._12_2_ = uVar112;
  auVar282._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar16 >> 0x20);
  auVar281._12_4_ = auVar282._12_4_;
  auVar281._8_2_ = 0;
  auVar281._0_8_ = uVar16;
  auVar281._10_2_ = uVar112;
  auVar280._10_6_ = auVar281._10_6_;
  auVar280._8_2_ = uVar112;
  auVar280._0_8_ = uVar16;
  uVar112 = (undefined2)(uVar16 >> 0x10);
  auVar47._4_8_ = auVar280._8_8_;
  auVar47._2_2_ = uVar112;
  auVar47._0_2_ = uVar112;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar20 * 0x20 - uVar57) + 6);
  uVar112 = (undefined2)(uVar17 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar17;
  auVar97._12_2_ = uVar112;
  auVar97._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar17 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar17;
  auVar96._10_2_ = uVar112;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar112;
  auVar95._0_8_ = uVar17;
  uVar112 = (undefined2)(uVar17 >> 0x10);
  auVar48._4_8_ = auVar95._8_8_;
  auVar48._2_2_ = uVar112;
  auVar48._0_2_ = uVar112;
  fVar191 = (float)(auVar48._0_4_ >> 0x10);
  fVar234 = (float)(auVar95._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar57 * 0x23 + 6);
  uVar112 = (undefined2)(uVar57 >> 0x30);
  auVar293._8_4_ = 0;
  auVar293._0_8_ = uVar57;
  auVar293._12_2_ = uVar112;
  auVar293._14_2_ = uVar112;
  uVar112 = (undefined2)(uVar57 >> 0x20);
  auVar292._12_4_ = auVar293._12_4_;
  auVar292._8_2_ = 0;
  auVar292._0_8_ = uVar57;
  auVar292._10_2_ = uVar112;
  auVar291._10_6_ = auVar292._10_6_;
  auVar291._8_2_ = uVar112;
  auVar291._0_8_ = uVar57;
  uVar112 = (undefined2)(uVar57 >> 0x10);
  auVar49._4_8_ = auVar291._8_8_;
  auVar49._2_2_ = uVar112;
  auVar49._0_2_ = uVar112;
  auVar179._0_8_ =
       CONCAT44(((((float)(auVar39._0_4_ >> 0x10) - fVar155) * fVar273 + fVar155) - fVar311) *
                fVar115,((((float)(int)(short)uVar9 - (float)(int)(short)uVar61) * fVar273 +
                         (float)(int)(short)uVar61) - fVar305) * fVar171);
  auVar179._8_4_ =
       ((((float)(auVar176._8_4_ >> 0x10) - fVar202) * fVar273 + fVar202) - fVar312) * fVar192;
  auVar179._12_4_ =
       ((((float)(auVar177._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar313) * fVar235;
  auVar240._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar273 +
        (float)(int)(short)uVar10) - fVar305) * fVar171;
  auVar240._4_4_ =
       ((((float)(auVar41._0_4_ >> 0x10) - fVar158) * fVar273 + fVar158) - fVar311) * fVar115;
  auVar240._8_4_ =
       ((((float)(auVar237._8_4_ >> 0x10) - fVar224) * fVar273 + fVar224) - fVar312) * fVar192;
  auVar240._12_4_ =
       ((((float)(auVar238._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar313) * fVar235;
  auVar256._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar169) * fVar273 + fVar169) - fVar259) *
                fVar119,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar273 +
                         (float)(int)(short)uVar12) - fVar251) * fVar77);
  auVar256._8_4_ =
       ((((float)(auVar253._8_4_ >> 0x10) - fVar226) * fVar273 + fVar226) - fVar261) * fVar200;
  auVar256._12_4_ =
       ((((float)(auVar254._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar304) * fVar242;
  auVar269._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar63) * fVar273 +
        (float)(int)(short)uVar63) - fVar251) * fVar77;
  auVar269._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar174) * fVar273 + fVar174) - fVar259) * fVar119;
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar229) * fVar273 + fVar229) - fVar261) * fVar200;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar304) * fVar242;
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar283._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar190) * fVar273 + fVar190) - fVar247) *
                fVar153,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar273 +
                         (float)(int)(short)uVar15) - fVar244) * fVar113);
  auVar283._8_4_ =
       ((((float)(auVar280._8_4_ >> 0x10) - fVar233) * fVar273 + fVar233) - fVar248) * fVar201;
  auVar283._12_4_ =
       ((((float)(auVar281._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar264) * fVar243;
  auVar294._0_4_ =
       ((((float)(int)(short)uVar57 - (float)(int)(short)uVar17) * fVar273 +
        (float)(int)(short)uVar17) - fVar244) * fVar113;
  auVar294._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar191) * fVar273 + fVar191) - fVar247) * fVar153;
  auVar294._8_4_ =
       ((((float)(auVar291._8_4_ >> 0x10) - fVar234) * fVar273 + fVar234) - fVar248) * fVar201;
  auVar294._12_4_ =
       ((((float)(auVar292._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar264) * fVar243;
  auVar160._8_4_ = auVar179._8_4_;
  auVar160._0_8_ = auVar179._0_8_;
  auVar160._12_4_ = auVar179._12_4_;
  auVar161 = minps(auVar160,auVar240);
  auVar130._8_4_ = auVar256._8_4_;
  auVar130._0_8_ = auVar256._0_8_;
  auVar130._12_4_ = auVar256._12_4_;
  auVar79 = minps(auVar130,auVar269);
  auVar161 = maxps(auVar161,auVar79);
  auVar131._8_4_ = auVar283._8_4_;
  auVar131._0_8_ = auVar283._0_8_;
  auVar131._12_4_ = auVar283._12_4_;
  auVar79 = minps(auVar131,auVar294);
  auVar98._4_4_ = uVar56;
  auVar98._0_4_ = uVar56;
  auVar98._8_4_ = uVar56;
  auVar98._12_4_ = uVar56;
  auVar79 = maxps(auVar79,auVar98);
  auVar79 = maxps(auVar161,auVar79);
  auVar161 = maxps(auVar179,auVar240);
  auVar257 = maxps(auVar256,auVar269);
  auVar161 = minps(auVar161,auVar257);
  local_48 = auVar79._0_4_ * 0.99999964;
  fStack_44 = auVar79._4_4_ * 0.99999964;
  fStack_40 = auVar79._8_4_ * 0.99999964;
  fStack_3c = auVar79._12_4_ * 0.99999964;
  auVar79 = maxps(auVar283,auVar294);
  uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar99._4_4_ = uVar56;
  auVar99._0_4_ = uVar56;
  auVar99._8_4_ = uVar56;
  auVar99._12_4_ = uVar56;
  auVar79 = minps(auVar79,auVar99);
  auVar79 = minps(auVar161,auVar79);
  uVar68 = (uint)(byte)PVar20;
  auVar132._0_4_ = -(uint)(uVar68 != 0 && local_48 <= auVar79._0_4_ * 1.0000004);
  auVar132._4_4_ = -(uint)(1 < uVar68 && fStack_44 <= auVar79._4_4_ * 1.0000004);
  auVar132._8_4_ = -(uint)(2 < uVar68 && fStack_40 <= auVar79._8_4_ * 1.0000004);
  auVar132._12_4_ = -(uint)(3 < uVar68 && fStack_3c <= auVar79._12_4_ * 1.0000004);
  uVar68 = movmskps(uVar68,auVar132);
  if (uVar68 != 0) {
    uVar68 = uVar68 & 0xff;
    local_218 = pre->ray_space + k;
    local_388 = mm_lookupmask_ps._0_8_;
    uStack_380 = mm_lookupmask_ps._8_8_;
    local_2c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_3b0 = pre;
    local_2c0 = ray;
    local_210 = prim;
    do {
      lVar24 = 0;
      if (uVar68 != 0) {
        for (; (uVar68 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      uVar69 = *(uint *)(local_210 + 2);
      pRVar64 = (RTCIntersectArguments *)(ulong)uVar69;
      uVar71 = *(uint *)(local_210 + lVar24 * 4 + 6);
      pGVar22 = (context->scene->geometries).items[(long)pRVar64].ptr;
      uVar61 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                               (ulong)uVar71 *
                               pGVar22[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar171 = pGVar22->fnumTimeSegments;
      fVar77 = (pGVar22->time_range).lower;
      fVar113 = ((*(float *)(ray + k * 4 + 0x70) - fVar77) / ((pGVar22->time_range).upper - fVar77))
                * fVar171;
      fVar77 = floorf(fVar113);
      fVar171 = fVar171 + -1.0;
      if (fVar171 <= fVar77) {
        fVar77 = fVar171;
      }
      fVar171 = 0.0;
      if (0.0 <= fVar77) {
        fVar171 = fVar77;
      }
      _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      pGVar65 = (Geometry *)((long)(int)fVar171 * 0x38);
      lVar24 = *(long *)((long)&pGVar65->device + _Var23);
      lVar66 = *(long *)((long)&pGVar65->modCounter_ + _Var23);
      lVar67 = *(long *)((long)&pGVar65->occlusionFilterN + _Var23);
      pfVar1 = (float *)(lVar66 + uVar61 * lVar67);
      pfVar2 = (float *)(lVar66 + (uVar61 + 1) * lVar67);
      pfVar3 = (float *)(lVar66 + (uVar61 + 2) * lVar67);
      fVar113 = fVar113 - fVar171;
      fVar171 = 1.0 - fVar113;
      pfVar4 = (float *)(lVar66 + lVar67 * (uVar61 + 3));
      lVar66 = *(long *)((long)&(pGVar65->super_RefCount)._vptr_RefCount + _Var23);
      pfVar5 = (float *)(lVar66 + lVar24 * uVar61);
      pfVar6 = (float *)(lVar66 + lVar24 * (uVar61 + 1));
      local_358 = *pfVar5 * fVar171 + *pfVar1 * fVar113;
      fStack_354 = pfVar5[1] * fVar171 + pfVar1[1] * fVar113;
      fStack_350 = pfVar5[2] * fVar171 + pfVar1[2] * fVar113;
      fStack_34c = pfVar5[3] * fVar171 + pfVar1[3] * fVar113;
      local_368 = *pfVar6 * fVar171 + *pfVar2 * fVar113;
      fStack_364 = pfVar6[1] * fVar171 + pfVar2[1] * fVar113;
      fStack_360 = pfVar6[2] * fVar171 + pfVar2[2] * fVar113;
      fStack_35c = pfVar6[3] * fVar171 + pfVar2[3] * fVar113;
      pfVar1 = (float *)(lVar66 + lVar24 * (uVar61 + 2));
      local_378 = *pfVar1 * fVar171 + *pfVar3 * fVar113;
      fStack_374 = pfVar1[1] * fVar171 + pfVar3[1] * fVar113;
      fStack_370 = pfVar1[2] * fVar171 + pfVar3[2] * fVar113;
      fStack_36c = pfVar1[3] * fVar171 + pfVar3[3] * fVar113;
      pfVar1 = (float *)(lVar66 + lVar24 * (uVar61 + 3));
      local_348 = fVar171 * *pfVar1 + fVar113 * *pfVar4;
      fStack_344 = fVar171 * pfVar1[1] + fVar113 * pfVar4[1];
      fStack_340 = fVar171 * pfVar1[2] + fVar113 * pfVar4[2];
      fStack_33c = fVar171 * pfVar1[3] + fVar113 * pfVar4[3];
      iVar21 = (int)pGVar22[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar171 = *(float *)(ray + k * 4);
      fVar77 = *(float *)(ray + k * 4 + 0x10);
      fVar113 = *(float *)(ray + k * 4 + 0x20);
      fVar192 = local_358 - fVar171;
      fVar200 = fStack_354 - fVar77;
      fVar201 = fStack_350 - fVar113;
      fVar115 = (local_218->vx).field_0.m128[0];
      fVar119 = (local_218->vx).field_0.m128[1];
      fVar153 = (local_218->vx).field_0.m128[2];
      fVar155 = (local_218->vy).field_0.m128[0];
      fVar158 = (local_218->vy).field_0.m128[1];
      fVar169 = (local_218->vy).field_0.m128[2];
      fVar174 = (local_218->vz).field_0.m128[0];
      fVar190 = (local_218->vz).field_0.m128[1];
      fVar191 = (local_218->vz).field_0.m128[2];
      local_228 = fVar192 * fVar115 + fVar200 * fVar155 + fVar201 * fVar174;
      local_298 = fVar192 * fVar119 + fVar200 * fVar158 + fVar201 * fVar190;
      fVar202 = fVar192 * fVar153 + fVar200 * fVar169 + fVar201 * fVar191;
      fVar192 = local_368 - fVar171;
      fVar200 = fStack_364 - fVar77;
      fVar201 = fStack_360 - fVar113;
      local_328 = fVar192 * fVar115 + fVar200 * fVar155 + fVar201 * fVar174;
      local_338 = fVar192 * fVar119 + fVar200 * fVar158 + fVar201 * fVar190;
      fVar224 = fVar192 * fVar153 + fVar200 * fVar169 + fVar201 * fVar191;
      fVar192 = local_378 - fVar171;
      fVar200 = fStack_374 - fVar77;
      fVar201 = fStack_370 - fVar113;
      local_2d8 = fVar192 * fVar115 + fVar200 * fVar155 + fVar201 * fVar174;
      fVar226 = fVar192 * fVar119 + fVar200 * fVar158 + fVar201 * fVar190;
      local_278 = fVar192 * fVar153 + fVar200 * fVar169 + fVar201 * fVar191;
      fVar171 = local_348 - fVar171;
      fVar77 = fStack_344 - fVar77;
      fVar113 = fStack_340 - fVar113;
      fVar115 = fVar171 * fVar115 + fVar77 * fVar155 + fVar113 * fVar174;
      fVar119 = fVar171 * fVar119 + fVar77 * fVar158 + fVar113 * fVar190;
      local_288 = fVar171 * fVar153 + fVar77 * fVar169 + fVar113 * fVar191;
      auVar270._0_8_ = CONCAT44(local_298,local_228) & 0x7fffffff7fffffff;
      auVar270._8_4_ = ABS(fVar202);
      auVar270._12_4_ = ABS(fStack_34c);
      auVar193._0_8_ = CONCAT44(local_338,local_328) & 0x7fffffff7fffffff;
      auVar193._8_4_ = ABS(fVar224);
      auVar193._12_4_ = ABS(fStack_35c);
      auVar161 = maxps(auVar270,auVar193);
      auVar219._0_8_ = CONCAT44(fVar226,local_2d8) & 0x7fffffff7fffffff;
      auVar219._8_4_ = ABS(local_278);
      auVar219._12_4_ = ABS(fStack_36c);
      auVar133._0_8_ = CONCAT44(fVar119,fVar115) & 0x7fffffff7fffffff;
      auVar133._8_4_ = ABS(local_288);
      auVar133._12_4_ = ABS(fStack_33c);
      auVar79 = maxps(auVar219,auVar133);
      auVar79 = maxps(auVar161,auVar79);
      uVar117 = auVar79._8_8_;
      fVar171 = auVar79._4_4_;
      if (auVar79._4_4_ <= auVar79._0_4_) {
        fVar171 = auVar79._0_4_;
      }
      auVar271._8_8_ = uVar117;
      auVar271._0_8_ = uVar117;
      fVar77 = (float)iVar21;
      local_2b8 = ZEXT416((uint)fVar77);
      if (auVar79._8_4_ <= fVar171) {
        auVar272._4_12_ = auVar271._4_12_;
        auVar272._0_4_ = fVar171;
        uVar117 = auVar272._0_8_;
      }
      pRVar62 = (RTCIntersectArguments *)((long)iVar21 * 0x40);
      uVar56 = SUB84(pRVar62,0);
      lVar24 = (long)iVar21 * 0x44;
      pauVar8 = (undefined1 (*) [16])(catmullrom_basis0 + lVar24 + 0x908);
      fVar171 = *(float *)*pauVar8;
      fVar113 = *(float *)(catmullrom_basis0 + lVar24 + 0x90c);
      fVar153 = *(float *)(catmullrom_basis0 + lVar24 + 0x910);
      auVar30 = *(undefined1 (*) [12])*pauVar8;
      fVar155 = *(float *)(catmullrom_basis0 + lVar24 + 0x914);
      fVar158 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar24 + 0xd8c);
      fVar169 = *(float *)(catmullrom_basis0 + lVar24 + 0xd90);
      fVar174 = *(float *)(catmullrom_basis0 + lVar24 + 0xd94);
      auVar29 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar24 + 0xd8c);
      fVar190 = *(float *)(catmullrom_basis0 + lVar24 + 0xd98);
      fVar191 = *(float *)(catmullrom_basis0 + lVar24 + 0x484);
      fVar192 = *(float *)(catmullrom_basis0 + lVar24 + 0x488);
      fVar200 = *(float *)(catmullrom_basis0 + lVar24 + 0x48c);
      fVar201 = *(float *)(catmullrom_basis0 + lVar24 + 0x490);
      fVar229 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar24);
      fVar233 = *(float *)(catmullrom_basis0 + lVar24 + 4);
      fVar234 = *(float *)(catmullrom_basis0 + lVar24 + 8);
      auVar31 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar24);
      fVar235 = *(float *)(catmullrom_basis0 + lVar24 + 0xc);
      local_248 = local_228 * fVar229 +
                  local_328 * fVar191 + local_2d8 * fVar171 + fVar115 * fVar158;
      fStack_244 = local_228 * fVar233 +
                   local_328 * fVar192 + local_2d8 * fVar113 + fVar115 * fVar169;
      fStack_240 = local_228 * fVar234 +
                   local_328 * fVar200 + local_2d8 * fVar153 + fVar115 * fVar174;
      fStack_23c = local_228 * fVar235 +
                   local_328 * fVar201 + local_2d8 * fVar155 + fVar115 * fVar190;
      fVar278 = local_298 * fVar229 + local_338 * fVar191 + fVar226 * fVar171 + fVar119 * fVar158;
      fVar285 = local_298 * fVar233 + local_338 * fVar192 + fVar226 * fVar113 + fVar119 * fVar169;
      fVar287 = local_298 * fVar234 + local_338 * fVar200 + fVar226 * fVar153 + fVar119 * fVar174;
      fVar298 = local_298 * fVar235 + local_338 * fVar201 + fVar226 * fVar155 + fVar119 * fVar190;
      fVar304 = fStack_34c * fVar229 +
                fStack_35c * fVar191 + fStack_36c * fVar171 + fStack_33c * fVar158;
      fVar247 = fStack_34c * fVar233 +
                fStack_35c * fVar192 + fStack_36c * fVar113 + fStack_33c * fVar169;
      auVar245._4_4_ = fVar247;
      auVar245._0_4_ = fVar304;
      fVar264 = fStack_34c * fVar234 +
                fStack_35c * fVar200 + fStack_36c * fVar153 + fStack_33c * fVar174;
      fVar275 = fStack_34c * fVar235 +
                fStack_35c * fVar201 + fStack_36c * fVar155 + fStack_33c * fVar190;
      fVar113 = *(float *)(catmullrom_basis1 + lVar24 + 0xd8c);
      fVar153 = *(float *)(catmullrom_basis1 + lVar24 + 0xd90);
      fVar158 = *(float *)(catmullrom_basis1 + lVar24 + 0xd94);
      fVar169 = *(float *)(catmullrom_basis1 + lVar24 + 0xd98);
      local_258 = *(float *)(catmullrom_basis1 + lVar24 + 0x908);
      fStack_254 = *(float *)(catmullrom_basis1 + lVar24 + 0x90c);
      fStack_250 = *(float *)(catmullrom_basis1 + lVar24 + 0x910);
      fStack_24c = *(float *)(catmullrom_basis1 + lVar24 + 0x914);
      local_128 = fStack_33c;
      fStack_124 = fStack_33c;
      fStack_120 = fStack_33c;
      fStack_11c = fStack_33c;
      local_118 = fStack_36c;
      fStack_114 = fStack_36c;
      fStack_110 = fStack_36c;
      fStack_10c = fStack_36c;
      fVar174 = *(float *)(catmullrom_basis1 + lVar24 + 0x484);
      fVar229 = *(float *)(catmullrom_basis1 + lVar24 + 0x488);
      fVar233 = *(float *)(catmullrom_basis1 + lVar24 + 0x48c);
      fVar234 = *(float *)(catmullrom_basis1 + lVar24 + 0x490);
      local_138 = fStack_35c;
      fStack_134 = fStack_35c;
      fStack_130 = fStack_35c;
      fStack_12c = fStack_35c;
      fVar242 = *(float *)(catmullrom_basis1 + lVar24);
      fVar243 = *(float *)(catmullrom_basis1 + lVar24 + 4);
      fVar251 = *(float *)(catmullrom_basis1 + lVar24 + 8);
      fVar259 = *(float *)(catmullrom_basis1 + lVar24 + 0xc);
      local_238 = local_228 * fVar242 +
                  local_328 * fVar174 + local_2d8 * local_258 + fVar115 * fVar113;
      fStack_234 = local_228 * fVar243 +
                   local_328 * fVar229 + local_2d8 * fStack_254 + fVar115 * fVar153;
      fStack_230 = local_228 * fVar251 +
                   local_328 * fVar233 + local_2d8 * fStack_250 + fVar115 * fVar158;
      fStack_22c = local_228 * fVar259 +
                   local_328 * fVar234 + local_2d8 * fStack_24c + fVar115 * fVar169;
      fVar261 = local_298 * fVar242 + local_338 * fVar174 + fVar226 * local_258 + fVar119 * fVar113;
      fVar244 = local_298 * fVar243 + local_338 * fVar229 + fVar226 * fStack_254 + fVar119 * fVar153
      ;
      fVar248 = local_298 * fVar251 + local_338 * fVar233 + fVar226 * fStack_250 + fVar119 * fVar158
      ;
      fVar273 = local_298 * fVar259 + local_338 * fVar234 + fVar226 * fStack_24c + fVar119 * fVar169
      ;
      local_148 = fStack_34c;
      fStack_144 = fStack_34c;
      fStack_140 = fStack_34c;
      fStack_13c = fStack_34c;
      fVar320 = fStack_34c * fVar242 +
                fStack_35c * fVar174 + fStack_36c * local_258 + fStack_33c * fVar113;
      fVar322 = fStack_34c * fVar243 +
                fStack_35c * fVar229 + fStack_36c * fStack_254 + fStack_33c * fVar153;
      fVar324 = fStack_34c * fVar251 +
                fStack_35c * fVar233 + fStack_36c * fStack_250 + fStack_33c * fVar158;
      fVar326 = fStack_34c * fVar259 +
                fStack_35c * fVar234 + fStack_36c * fStack_24c + fStack_33c * fVar169;
      fVar313 = local_238 - local_248;
      fVar225 = fStack_234 - fStack_244;
      fVar227 = fStack_230 - fStack_240;
      fVar228 = fStack_22c - fStack_23c;
      fVar302 = fVar261 - fVar278;
      fVar305 = fVar244 - fVar285;
      fVar311 = fVar248 - fVar287;
      fVar312 = fVar273 - fVar298;
      fVar171 = fVar278 * fVar313 - local_248 * fVar302;
      fVar286 = fVar285 * fVar225 - fStack_244 * fVar305;
      fVar288 = fVar287 * fVar227 - fStack_240 * fVar311;
      fVar300 = fVar298 * fVar228 - fStack_23c * fVar312;
      auVar245._8_4_ = fVar264;
      auVar245._12_4_ = fVar275;
      auVar25._4_4_ = fVar322;
      auVar25._0_4_ = fVar320;
      auVar25._8_4_ = fVar324;
      auVar25._12_4_ = fVar326;
      auVar79 = maxps(auVar245,auVar25);
      bVar52 = fVar171 * fVar171 <=
               auVar79._0_4_ * auVar79._0_4_ * (fVar313 * fVar313 + fVar302 * fVar302) &&
               0.0 < fVar77;
      auVar180._0_4_ = -(uint)bVar52;
      bVar53 = fVar286 * fVar286 <=
               auVar79._4_4_ * auVar79._4_4_ * (fVar225 * fVar225 + fVar305 * fVar305) &&
               1.0 < fVar77;
      auVar180._4_4_ = -(uint)bVar53;
      bVar51 = fVar288 * fVar288 <=
               auVar79._8_4_ * auVar79._8_4_ * (fVar227 * fVar227 + fVar311 * fVar311) &&
               2.0 < fVar77;
      auVar180._8_4_ = -(uint)bVar51;
      bVar50 = fVar300 * fVar300 <=
               auVar79._12_4_ * auVar79._12_4_ * (fVar228 * fVar228 + fVar312 * fVar312) &&
               3.0 < fVar77;
      auVar180._12_4_ = -(uint)bVar50;
      local_478 = (float)uVar117;
      local_478 = local_478 * 4.7683716e-07;
      iVar55 = movmskps(iVar21,auVar180);
      fVar171 = *(float *)(ray + k * 4 + 0x30);
      _local_2a8 = ZEXT416((uint)fVar171);
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      fStack_324 = local_328;
      fStack_320 = local_328;
      fStack_31c = local_328;
      _local_2e8 = *pauVar8;
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      fStack_274 = local_278;
      fStack_270 = local_278;
      fStack_26c = local_278;
      fStack_224 = local_228;
      fStack_220 = local_228;
      fStack_21c = local_228;
      if (iVar55 != 0) {
        fVar159 = fVar113 * local_288 + local_258 * local_278 + fVar174 * fVar224 +
                  fVar242 * fVar202;
        fVar170 = fVar153 * local_288 + fStack_254 * local_278 + fVar229 * fVar224 +
                  fVar243 * fVar202;
        fVar172 = fVar158 * local_288 + fStack_250 * local_278 + fVar233 * fVar224 +
                  fVar251 * fVar202;
        fVar173 = fVar169 * local_288 + fStack_24c * local_278 + fVar234 * fVar224 +
                  fVar259 * fVar202;
        local_438 = auVar31._0_4_;
        fStack_434 = auVar31._4_4_;
        fStack_430 = auVar31._8_4_;
        local_2e8._0_4_ = auVar30._0_4_;
        local_2e8._4_4_ = auVar30._4_4_;
        fStack_2e0 = auVar30._8_4_;
        local_508._0_4_ = auVar29._0_4_;
        local_508._4_4_ = auVar29._4_4_;
        fStack_500 = auVar29._8_4_;
        fVar78 = (float)local_508._0_4_ * local_288 + (float)local_2e8._0_4_ * local_278 +
                 fVar191 * fVar224 + local_438 * fVar202;
        fVar114 = (float)local_508._4_4_ * local_288 + (float)local_2e8._4_4_ * local_278 +
                  fVar192 * fVar224 + fStack_434 * fVar202;
        fVar116 = fStack_500 * local_288 + fStack_2e0 * local_278 + fVar200 * fVar224 +
                  fStack_430 * fVar202;
        fVar118 = fVar190 * local_288 + fVar155 * local_278 + fVar201 * fVar224 + fVar235 * fVar202;
        fVar113 = *(float *)(catmullrom_basis0 + lVar24 + 0x1210);
        fVar153 = *(float *)(catmullrom_basis0 + lVar24 + 0x1214);
        fVar155 = *(float *)(catmullrom_basis0 + lVar24 + 0x1218);
        fVar158 = *(float *)(catmullrom_basis0 + lVar24 + 0x121c);
        fVar169 = *(float *)(catmullrom_basis0 + lVar24 + 0x1694);
        fVar174 = *(float *)(catmullrom_basis0 + lVar24 + 0x1698);
        fVar190 = *(float *)(catmullrom_basis0 + lVar24 + 0x169c);
        fVar191 = *(float *)(catmullrom_basis0 + lVar24 + 0x16a0);
        fVar192 = *(float *)(catmullrom_basis0 + lVar24 + 0x1b18);
        fVar200 = *(float *)(catmullrom_basis0 + lVar24 + 0x1b1c);
        fVar201 = *(float *)(catmullrom_basis0 + lVar24 + 0x1b20);
        fVar229 = *(float *)(catmullrom_basis0 + lVar24 + 0x1b24);
        fVar233 = *(float *)(catmullrom_basis0 + lVar24 + 0x1f9c);
        fVar234 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa0);
        fVar235 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa4);
        fVar242 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa8);
        auVar27._4_4_ = local_228;
        auVar27._0_4_ = local_228;
        auVar27._8_4_ = local_228;
        auVar27._12_4_ = local_228;
        fVar265 = local_228 * fVar113 +
                  local_328 * fVar169 + local_2d8 * fVar192 + fVar115 * fVar233;
        fVar274 = local_228 * fVar153 +
                  local_328 * fVar174 + local_2d8 * fVar200 + fVar115 * fVar234;
        fVar276 = local_228 * fVar155 +
                  local_328 * fVar190 + local_2d8 * fVar201 + fVar115 * fVar235;
        fVar277 = local_228 * fVar158 +
                  local_328 * fVar191 + local_2d8 * fVar229 + fVar115 * fVar242;
        fVar321 = local_298 * fVar113 + local_338 * fVar169 + fVar226 * fVar192 + fVar119 * fVar233;
        fVar323 = local_298 * fVar153 + local_338 * fVar174 + fVar226 * fVar200 + fVar119 * fVar234;
        fVar325 = local_298 * fVar155 + local_338 * fVar190 + fVar226 * fVar201 + fVar119 * fVar235;
        fVar327 = local_298 * fVar158 + local_338 * fVar191 + fVar226 * fVar229 + fVar119 * fVar242;
        fVar243 = *(float *)(catmullrom_basis1 + lVar24 + 0x1210);
        fVar251 = *(float *)(catmullrom_basis1 + lVar24 + 0x1214);
        fVar259 = *(float *)(catmullrom_basis1 + lVar24 + 0x1218);
        fVar286 = *(float *)(catmullrom_basis1 + lVar24 + 0x121c);
        fVar288 = *(float *)(catmullrom_basis1 + lVar24 + 0x1b18);
        fVar300 = *(float *)(catmullrom_basis1 + lVar24 + 0x1b1c);
        fVar249 = *(float *)(catmullrom_basis1 + lVar24 + 0x1b20);
        fVar250 = *(float *)(catmullrom_basis1 + lVar24 + 0x1b24);
        fVar252 = *(float *)(catmullrom_basis1 + lVar24 + 0x1f9c);
        fVar260 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa0);
        fVar262 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa4);
        fVar263 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa8);
        fVar289 = *(float *)(catmullrom_basis1 + lVar24 + 0x1694);
        fVar299 = *(float *)(catmullrom_basis1 + lVar24 + 0x1698);
        fVar301 = *(float *)(catmullrom_basis1 + lVar24 + 0x169c);
        fVar303 = *(float *)(catmullrom_basis1 + lVar24 + 0x16a0);
        fVar314 = local_228 * fVar243 +
                  local_328 * fVar289 + local_2d8 * fVar288 + fVar115 * fVar252;
        fVar317 = local_228 * fVar251 +
                  local_328 * fVar299 + local_2d8 * fVar300 + fVar115 * fVar260;
        fVar318 = local_228 * fVar259 +
                  local_328 * fVar301 + local_2d8 * fVar249 + fVar115 * fVar262;
        fVar319 = local_228 * fVar286 +
                  local_328 * fVar303 + local_2d8 * fVar250 + fVar115 * fVar263;
        fVar120 = local_298 * fVar243 + local_338 * fVar289 + fVar226 * fVar288 + fVar119 * fVar252;
        fVar154 = local_298 * fVar251 + local_338 * fVar299 + fVar226 * fVar300 + fVar119 * fVar260;
        fVar156 = local_298 * fVar259 + local_338 * fVar301 + fVar226 * fVar249 + fVar119 * fVar262;
        fVar157 = local_298 * fVar286 + local_338 * fVar303 + fVar226 * fVar250 + fVar119 * fVar263;
        auVar295._0_8_ = CONCAT44(fVar274,fVar265) & 0x7fffffff7fffffff;
        auVar295._8_4_ = ABS(fVar276);
        auVar295._12_4_ = ABS(fVar277);
        auVar246._0_8_ = CONCAT44(fVar323,fVar321) & 0x7fffffff7fffffff;
        auVar246._8_4_ = ABS(fVar325);
        auVar246._12_4_ = ABS(fVar327);
        auVar79 = maxps(auVar295,auVar246);
        auVar306._0_8_ =
             CONCAT44(fVar153 * fVar202 +
                      fVar174 * fVar224 + fVar200 * local_278 + fVar234 * local_288,
                      fVar113 * fVar202 +
                      fVar169 * fVar224 + fVar192 * local_278 + fVar233 * local_288) &
             0x7fffffff7fffffff;
        auVar306._8_4_ =
             ABS(fVar155 * fVar202 + fVar190 * fVar224 + fVar201 * local_278 + fVar235 * local_288);
        auVar306._12_4_ =
             ABS(fVar158 * fVar202 + fVar191 * fVar224 + fVar229 * local_278 + fVar242 * local_288);
        auVar79 = maxps(auVar79,auVar306);
        uVar73 = -(uint)(local_478 <= auVar79._0_4_);
        uVar70 = -(uint)(local_478 <= auVar79._4_4_);
        uVar72 = -(uint)(local_478 <= auVar79._8_4_);
        uVar74 = -(uint)(local_478 <= auVar79._12_4_);
        fVar169 = (float)((uint)fVar265 & uVar73 | ~uVar73 & (uint)fVar313);
        fVar174 = (float)((uint)fVar274 & uVar70 | ~uVar70 & (uint)fVar225);
        fVar190 = (float)((uint)fVar276 & uVar72 | ~uVar72 & (uint)fVar227);
        fVar191 = (float)((uint)fVar277 & uVar74 | ~uVar74 & (uint)fVar228);
        fVar233 = (float)(~uVar73 & (uint)fVar302 | (uint)fVar321 & uVar73);
        fVar234 = (float)(~uVar70 & (uint)fVar305 | (uint)fVar323 & uVar70);
        fVar235 = (float)(~uVar72 & (uint)fVar311 | (uint)fVar325 & uVar72);
        fVar242 = (float)(~uVar74 & (uint)fVar312 | (uint)fVar327 & uVar74);
        auVar307._0_8_ = CONCAT44(fVar317,fVar314) & 0x7fffffff7fffffff;
        auVar307._8_4_ = ABS(fVar318);
        auVar307._12_4_ = ABS(fVar319);
        auVar258._0_8_ = CONCAT44(fVar154,fVar120) & 0x7fffffff7fffffff;
        auVar258._8_4_ = ABS(fVar156);
        auVar258._12_4_ = ABS(fVar157);
        auVar79 = maxps(auVar307,auVar258);
        auVar231._0_8_ =
             CONCAT44(fVar251 * fVar202 +
                      fVar299 * fVar224 + fVar300 * local_278 + fVar260 * local_288,
                      fVar243 * fVar202 +
                      fVar289 * fVar224 + fVar288 * local_278 + fVar252 * local_288) &
             0x7fffffff7fffffff;
        auVar231._8_4_ =
             ABS(fVar259 * fVar202 + fVar301 * fVar224 + fVar249 * local_278 + fVar262 * local_288);
        auVar231._12_4_ =
             ABS(fVar286 * fVar202 + fVar303 * fVar224 + fVar250 * local_278 + fVar263 * local_288);
        auVar79 = maxps(auVar79,auVar231);
        uVar73 = -(uint)(local_478 <= auVar79._0_4_);
        uVar70 = -(uint)(local_478 <= auVar79._4_4_);
        uVar72 = -(uint)(local_478 <= auVar79._8_4_);
        uVar74 = -(uint)(local_478 <= auVar79._12_4_);
        fVar300 = (float)((uint)fVar314 & uVar73 | ~uVar73 & (uint)fVar313);
        fVar313 = (float)((uint)fVar317 & uVar70 | ~uVar70 & (uint)fVar225);
        fVar225 = (float)((uint)fVar318 & uVar72 | ~uVar72 & (uint)fVar227);
        fVar227 = (float)((uint)fVar319 & uVar74 | ~uVar74 & (uint)fVar228);
        fVar243 = (float)(~uVar73 & (uint)fVar302 | (uint)fVar120 & uVar73);
        fVar259 = (float)(~uVar70 & (uint)fVar305 | (uint)fVar154 & uVar70);
        fVar286 = (float)(~uVar72 & (uint)fVar311 | (uint)fVar156 & uVar72);
        fVar288 = (float)(~uVar74 & (uint)fVar312 | (uint)fVar157 & uVar74);
        auVar134._0_4_ = fVar233 * fVar233 + fVar169 * fVar169;
        auVar134._4_4_ = fVar234 * fVar234 + fVar174 * fVar174;
        auVar134._8_4_ = fVar235 * fVar235 + fVar190 * fVar190;
        auVar134._12_4_ = fVar242 * fVar242 + fVar191 * fVar191;
        auVar79 = rsqrtps(auVar27,auVar134);
        fVar113 = auVar79._0_4_;
        fVar153 = auVar79._4_4_;
        fVar155 = auVar79._8_4_;
        fVar158 = auVar79._12_4_;
        auVar194._0_4_ = fVar113 * fVar113 * auVar134._0_4_ * 0.5 * fVar113;
        auVar194._4_4_ = fVar153 * fVar153 * auVar134._4_4_ * 0.5 * fVar153;
        auVar194._8_4_ = fVar155 * fVar155 * auVar134._8_4_ * 0.5 * fVar155;
        auVar194._12_4_ = fVar158 * fVar158 * auVar134._12_4_ * 0.5 * fVar158;
        fVar302 = fVar113 * 1.5 - auVar194._0_4_;
        fVar311 = fVar153 * 1.5 - auVar194._4_4_;
        fVar312 = fVar155 * 1.5 - auVar194._8_4_;
        fVar228 = fVar158 * 1.5 - auVar194._12_4_;
        auVar135._0_4_ = fVar243 * fVar243 + fVar300 * fVar300;
        auVar135._4_4_ = fVar259 * fVar259 + fVar313 * fVar313;
        auVar135._8_4_ = fVar286 * fVar286 + fVar225 * fVar225;
        auVar135._12_4_ = fVar288 * fVar288 + fVar227 * fVar227;
        auVar79 = rsqrtps(auVar194,auVar135);
        fVar113 = auVar79._0_4_;
        fVar153 = auVar79._4_4_;
        fVar155 = auVar79._8_4_;
        fVar158 = auVar79._12_4_;
        fVar192 = fVar113 * 1.5 - fVar113 * fVar113 * auVar135._0_4_ * 0.5 * fVar113;
        fVar200 = fVar153 * 1.5 - fVar153 * fVar153 * auVar135._4_4_ * 0.5 * fVar153;
        fVar201 = fVar155 * 1.5 - fVar155 * fVar155 * auVar135._8_4_ * 0.5 * fVar155;
        fVar229 = fVar158 * 1.5 - fVar158 * fVar158 * auVar135._12_4_ * 0.5 * fVar158;
        fVar289 = fVar233 * fVar302 * fVar304;
        fVar299 = fVar234 * fVar311 * fVar247;
        fVar301 = fVar235 * fVar312 * fVar264;
        fVar303 = fVar242 * fVar228 * fVar275;
        fVar234 = -fVar169 * fVar302 * fVar304;
        fVar242 = -fVar174 * fVar311 * fVar247;
        fVar251 = -fVar190 * fVar312 * fVar264;
        fVar305 = -fVar191 * fVar228 * fVar275;
        fVar265 = fVar302 * 0.0 * fVar304;
        fVar274 = fVar311 * 0.0 * fVar247;
        fVar276 = fVar312 * 0.0 * fVar264;
        fVar277 = fVar228 * 0.0 * fVar275;
        fVar120 = fVar243 * fVar192 * fVar320;
        fVar154 = fVar259 * fVar200 * fVar322;
        fVar156 = fVar286 * fVar201 * fVar324;
        fVar157 = fVar288 * fVar229 * fVar326;
        fVar169 = local_238 + fVar120;
        fVar174 = fStack_234 + fVar154;
        fVar190 = fStack_230 + fVar156;
        fVar191 = fStack_22c + fVar157;
        fVar252 = -fVar300 * fVar192 * fVar320;
        fVar260 = -fVar313 * fVar200 * fVar322;
        fVar262 = -fVar225 * fVar201 * fVar324;
        fVar263 = -fVar227 * fVar229 * fVar326;
        fVar113 = fVar261 + fVar252;
        fVar153 = fVar244 + fVar260;
        fVar155 = fVar248 + fVar262;
        fVar158 = fVar273 + fVar263;
        fVar227 = fVar192 * 0.0 * fVar320;
        fVar228 = fVar200 * 0.0 * fVar322;
        fVar249 = fVar201 * 0.0 * fVar324;
        fVar250 = fVar229 * 0.0 * fVar326;
        fVar192 = local_248 - fVar289;
        fVar200 = fStack_244 - fVar299;
        fVar201 = fStack_240 - fVar301;
        fVar229 = fStack_23c - fVar303;
        fVar311 = fVar159 + fVar227;
        fVar312 = fVar170 + fVar228;
        fVar313 = fVar172 + fVar249;
        fVar225 = fVar173 + fVar250;
        fVar233 = fVar278 - fVar234;
        fVar235 = fVar285 - fVar242;
        fVar243 = fVar287 - fVar251;
        fVar259 = fVar298 - fVar305;
        fVar286 = fVar78 - fVar265;
        fVar288 = fVar114 - fVar274;
        fVar300 = fVar116 - fVar276;
        fVar302 = fVar118 - fVar277;
        uVar73 = -(uint)(0.0 < (fVar233 * (fVar311 - fVar286) - fVar286 * (fVar113 - fVar233)) * 0.0
                               + (fVar286 * (fVar169 - fVar192) - (fVar311 - fVar286) * fVar192) *
                                 0.0 + ((fVar113 - fVar233) * fVar192 -
                                       (fVar169 - fVar192) * fVar233));
        uVar70 = -(uint)(0.0 < (fVar235 * (fVar312 - fVar288) - fVar288 * (fVar153 - fVar235)) * 0.0
                               + (fVar288 * (fVar174 - fVar200) - (fVar312 - fVar288) * fVar200) *
                                 0.0 + ((fVar153 - fVar235) * fVar200 -
                                       (fVar174 - fVar200) * fVar235));
        uVar72 = -(uint)(0.0 < (fVar243 * (fVar313 - fVar300) - fVar300 * (fVar155 - fVar243)) * 0.0
                               + (fVar300 * (fVar190 - fVar201) - (fVar313 - fVar300) * fVar201) *
                                 0.0 + ((fVar155 - fVar243) * fVar201 -
                                       (fVar190 - fVar201) * fVar243));
        uVar74 = -(uint)(0.0 < (fVar259 * (fVar225 - fVar302) - fVar302 * (fVar158 - fVar259)) * 0.0
                               + (fVar302 * (fVar191 - fVar229) - (fVar225 - fVar302) * fVar229) *
                                 0.0 + ((fVar158 - fVar259) * fVar229 -
                                       (fVar191 - fVar229) * fVar259));
        fVar120 = (float)((uint)(local_238 - fVar120) & uVar73 |
                         ~uVar73 & (uint)(local_248 + fVar289));
        fVar154 = (float)((uint)(fStack_234 - fVar154) & uVar70 |
                         ~uVar70 & (uint)(fStack_244 + fVar299));
        fVar301 = (float)((uint)(fStack_230 - fVar156) & uVar72 |
                         ~uVar72 & (uint)(fStack_240 + fVar301));
        fVar303 = (float)((uint)(fStack_22c - fVar157) & uVar74 |
                         ~uVar74 & (uint)(fStack_23c + fVar303));
        fVar252 = (float)((uint)(fVar261 - fVar252) & uVar73 | ~uVar73 & (uint)(fVar278 + fVar234));
        fVar260 = (float)((uint)(fVar244 - fVar260) & uVar70 | ~uVar70 & (uint)(fVar285 + fVar242));
        fVar262 = (float)((uint)(fVar248 - fVar262) & uVar72 | ~uVar72 & (uint)(fVar287 + fVar251));
        fVar263 = (float)((uint)(fVar273 - fVar263) & uVar74 | ~uVar74 & (uint)(fVar298 + fVar305));
        fVar298 = (float)((uint)(fVar159 - fVar227) & uVar73 | ~uVar73 & (uint)(fVar78 + fVar265));
        fVar305 = (float)((uint)(fVar170 - fVar228) & uVar70 | ~uVar70 & (uint)(fVar114 + fVar274));
        fVar227 = (float)((uint)(fVar172 - fVar249) & uVar72 | ~uVar72 & (uint)(fVar116 + fVar276));
        fVar228 = (float)((uint)(fVar173 - fVar250) & uVar74 | ~uVar74 & (uint)(fVar118 + fVar277));
        fVar244 = (float)((uint)fVar192 & uVar73 | ~uVar73 & (uint)fVar169);
        fVar248 = (float)((uint)fVar200 & uVar70 | ~uVar70 & (uint)fVar174);
        fVar273 = (float)((uint)fVar201 & uVar72 | ~uVar72 & (uint)fVar190);
        fVar278 = (float)((uint)fVar229 & uVar74 | ~uVar74 & (uint)fVar191);
        fVar234 = (float)((uint)fVar233 & uVar73 | ~uVar73 & (uint)fVar113);
        fVar242 = (float)((uint)fVar235 & uVar70 | ~uVar70 & (uint)fVar153);
        fVar251 = (float)((uint)fVar243 & uVar72 | ~uVar72 & (uint)fVar155);
        fVar261 = (float)((uint)fVar259 & uVar74 | ~uVar74 & (uint)fVar158);
        fVar249 = (float)((uint)fVar286 & uVar73 | ~uVar73 & (uint)fVar311);
        fVar250 = (float)((uint)fVar288 & uVar70 | ~uVar70 & (uint)fVar312);
        fVar289 = (float)((uint)fVar300 & uVar72 | ~uVar72 & (uint)fVar313);
        fVar299 = (float)((uint)fVar302 & uVar74 | ~uVar74 & (uint)fVar225);
        fVar192 = (float)((uint)fVar169 & uVar73 | ~uVar73 & (uint)fVar192) - fVar120;
        fVar200 = (float)((uint)fVar174 & uVar70 | ~uVar70 & (uint)fVar200) - fVar154;
        fVar201 = (float)((uint)fVar190 & uVar72 | ~uVar72 & (uint)fVar201) - fVar301;
        fVar229 = (float)((uint)fVar191 & uVar74 | ~uVar74 & (uint)fVar229) - fVar303;
        fVar113 = (float)((uint)fVar113 & uVar73 | ~uVar73 & (uint)fVar233) - fVar252;
        fVar153 = (float)((uint)fVar153 & uVar70 | ~uVar70 & (uint)fVar235) - fVar260;
        fVar155 = (float)((uint)fVar155 & uVar72 | ~uVar72 & (uint)fVar243) - fVar262;
        fVar158 = (float)((uint)fVar158 & uVar74 | ~uVar74 & (uint)fVar259) - fVar263;
        fVar285 = (float)((uint)fVar311 & uVar73 | ~uVar73 & (uint)fVar286) - fVar298;
        fVar286 = (float)((uint)fVar312 & uVar70 | ~uVar70 & (uint)fVar288) - fVar305;
        fVar287 = (float)((uint)fVar313 & uVar72 | ~uVar72 & (uint)fVar300) - fVar227;
        fVar288 = (float)((uint)fVar225 & uVar74 | ~uVar74 & (uint)fVar302) - fVar228;
        fVar313 = fVar120 - fVar244;
        fVar225 = fVar154 - fVar248;
        fVar78 = fVar301 - fVar273;
        fVar114 = fVar303 - fVar278;
        fVar233 = fVar252 - fVar234;
        fVar235 = fVar260 - fVar242;
        fVar243 = fVar262 - fVar251;
        fVar259 = fVar263 - fVar261;
        fVar169 = fVar298 - fVar249;
        fVar174 = fVar305 - fVar250;
        fVar190 = fVar227 - fVar289;
        fVar191 = fVar228 - fVar299;
        fVar300 = (fVar252 * fVar285 - fVar298 * fVar113) * 0.0 +
                  (fVar298 * fVar192 - fVar120 * fVar285) * 0.0 +
                  (fVar120 * fVar113 - fVar252 * fVar192);
        fVar302 = (fVar260 * fVar286 - fVar305 * fVar153) * 0.0 +
                  (fVar305 * fVar200 - fVar154 * fVar286) * 0.0 +
                  (fVar154 * fVar153 - fVar260 * fVar200);
        auVar181._4_4_ = fVar302;
        auVar181._0_4_ = fVar300;
        fVar311 = (fVar262 * fVar287 - fVar227 * fVar155) * 0.0 +
                  (fVar227 * fVar201 - fVar301 * fVar287) * 0.0 +
                  (fVar301 * fVar155 - fVar262 * fVar201);
        fVar312 = (fVar263 * fVar288 - fVar228 * fVar158) * 0.0 +
                  (fVar228 * fVar229 - fVar303 * fVar288) * 0.0 +
                  (fVar303 * fVar158 - fVar263 * fVar229);
        auVar315._0_4_ =
             (fVar234 * fVar169 - fVar249 * fVar233) * 0.0 +
             (fVar249 * fVar313 - fVar244 * fVar169) * 0.0 + (fVar244 * fVar233 - fVar234 * fVar313)
        ;
        auVar315._4_4_ =
             (fVar242 * fVar174 - fVar250 * fVar235) * 0.0 +
             (fVar250 * fVar225 - fVar248 * fVar174) * 0.0 + (fVar248 * fVar235 - fVar242 * fVar225)
        ;
        auVar315._8_4_ =
             (fVar251 * fVar190 - fVar289 * fVar243) * 0.0 +
             (fVar289 * fVar78 - fVar273 * fVar190) * 0.0 + (fVar273 * fVar243 - fVar251 * fVar78);
        auVar315._12_4_ =
             (fVar261 * fVar191 - fVar299 * fVar259) * 0.0 +
             (fVar299 * fVar114 - fVar278 * fVar191) * 0.0 + (fVar278 * fVar259 - fVar261 * fVar114)
        ;
        auVar181._8_4_ = fVar311;
        auVar181._12_4_ = fVar312;
        auVar79 = maxps(auVar181,auVar315);
        bVar52 = auVar79._0_4_ <= 0.0 && bVar52;
        auVar182._0_4_ = -(uint)bVar52;
        bVar53 = auVar79._4_4_ <= 0.0 && bVar53;
        auVar182._4_4_ = -(uint)bVar53;
        bVar51 = auVar79._8_4_ <= 0.0 && bVar51;
        auVar182._8_4_ = -(uint)bVar51;
        bVar50 = auVar79._12_4_ <= 0.0 && bVar50;
        auVar182._12_4_ = -(uint)bVar50;
        iVar55 = movmskps(iVar55,auVar182);
        if (iVar55 == 0) {
LAB_00b4a30c:
          auVar183._8_8_ = uStack_380;
          auVar183._0_8_ = local_388;
        }
        else {
          auVar195._0_4_ = fVar169 * fVar113;
          auVar195._4_4_ = fVar174 * fVar153;
          auVar195._8_4_ = fVar190 * fVar155;
          auVar195._12_4_ = fVar191 * fVar158;
          fVar234 = fVar233 * fVar285 - auVar195._0_4_;
          fVar242 = fVar235 * fVar286 - auVar195._4_4_;
          fVar251 = fVar243 * fVar287 - auVar195._8_4_;
          fVar261 = fVar259 * fVar288 - auVar195._12_4_;
          fVar169 = fVar169 * fVar192 - fVar285 * fVar313;
          fVar174 = fVar174 * fVar200 - fVar286 * fVar225;
          fVar190 = fVar190 * fVar201 - fVar287 * fVar78;
          fVar191 = fVar191 * fVar229 - fVar288 * fVar114;
          fVar113 = fVar313 * fVar113 - fVar233 * fVar192;
          fVar200 = fVar225 * fVar153 - fVar235 * fVar200;
          fVar201 = fVar78 * fVar155 - fVar243 * fVar201;
          fVar229 = fVar114 * fVar158 - fVar259 * fVar229;
          auVar220._0_4_ = fVar234 * 0.0 + fVar169 * 0.0 + fVar113;
          auVar220._4_4_ = fVar242 * 0.0 + fVar174 * 0.0 + fVar200;
          auVar220._8_4_ = fVar251 * 0.0 + fVar190 * 0.0 + fVar201;
          auVar220._12_4_ = fVar261 * 0.0 + fVar191 * 0.0 + fVar229;
          auVar79 = rcpps(auVar195,auVar220);
          fVar153 = auVar79._0_4_;
          fVar155 = auVar79._4_4_;
          fVar158 = auVar79._8_4_;
          fVar192 = auVar79._12_4_;
          fVar153 = (1.0 - auVar220._0_4_ * fVar153) * fVar153 + fVar153;
          fVar155 = (1.0 - auVar220._4_4_ * fVar155) * fVar155 + fVar155;
          fVar158 = (1.0 - auVar220._8_4_ * fVar158) * fVar158 + fVar158;
          fVar192 = (1.0 - auVar220._12_4_ * fVar192) * fVar192 + fVar192;
          fVar169 = (fVar298 * fVar113 + fVar252 * fVar169 + fVar120 * fVar234) * fVar153;
          fVar174 = (fVar305 * fVar200 + fVar260 * fVar174 + fVar154 * fVar242) * fVar155;
          fVar190 = (fVar227 * fVar201 + fVar262 * fVar190 + fVar301 * fVar251) * fVar158;
          fVar191 = (fVar228 * fVar229 + fVar263 * fVar191 + fVar303 * fVar261) * fVar192;
          fVar113 = *(float *)(ray + k * 4 + 0x80);
          bVar52 = (fVar169 <= fVar113 && fVar171 <= fVar169) && bVar52;
          auVar100._0_4_ = -(uint)bVar52;
          bVar53 = (fVar174 <= fVar113 && fVar171 <= fVar174) && bVar53;
          auVar100._4_4_ = -(uint)bVar53;
          bVar51 = (fVar190 <= fVar113 && fVar171 <= fVar190) && bVar51;
          auVar100._8_4_ = -(uint)bVar51;
          bVar50 = (fVar191 <= fVar113 && fVar171 <= fVar191) && bVar50;
          auVar100._12_4_ = -(uint)bVar50;
          iVar55 = movmskps(iVar55,auVar100);
          if (iVar55 == 0) goto LAB_00b4a30c;
          auVar101._0_8_ =
               CONCAT44(-(uint)(auVar220._4_4_ != 0.0 && bVar53),
                        -(uint)(auVar220._0_4_ != 0.0 && bVar52));
          auVar101._8_4_ = -(uint)(auVar220._8_4_ != 0.0 && bVar51);
          auVar101._12_4_ = -(uint)(auVar220._12_4_ != 0.0 && bVar50);
          iVar55 = movmskps(iVar55,auVar101);
          auVar183._8_8_ = uStack_380;
          auVar183._0_8_ = local_388;
          if (iVar55 != 0) {
            fVar300 = fVar300 * fVar153;
            fVar302 = fVar302 * fVar155;
            fVar311 = fVar311 * fVar158;
            fVar312 = fVar312 * fVar192;
            local_3e8 = (float)((uint)(1.0 - fVar300) & uVar73 | ~uVar73 & (uint)fVar300);
            fStack_3e4 = (float)((uint)(1.0 - fVar302) & uVar70 | ~uVar70 & (uint)fVar302);
            fStack_3e0 = (float)((uint)(1.0 - fVar311) & uVar72 | ~uVar72 & (uint)fVar311);
            fStack_3dc = (float)((uint)(1.0 - fVar312) & uVar74 | ~uVar74 & (uint)fVar312);
            local_268 = (float)(~uVar73 & (uint)(auVar315._0_4_ * fVar153) |
                               (uint)(1.0 - auVar315._0_4_ * fVar153) & uVar73);
            fStack_264 = (float)(~uVar70 & (uint)(auVar315._4_4_ * fVar155) |
                                (uint)(1.0 - auVar315._4_4_ * fVar155) & uVar70);
            fStack_260 = (float)(~uVar72 & (uint)(auVar315._8_4_ * fVar158) |
                                (uint)(1.0 - auVar315._8_4_ * fVar158) & uVar72);
            fStack_25c = (float)(~uVar74 & (uint)(auVar315._12_4_ * fVar192) |
                                (uint)(1.0 - auVar315._12_4_ * fVar192) & uVar74);
            auVar183._8_4_ = auVar101._8_4_;
            auVar183._0_8_ = auVar101._0_8_;
            auVar183._12_4_ = auVar101._12_4_;
            local_3f8 = fVar169;
            fStack_3f4 = fVar174;
            fStack_3f0 = fVar190;
            fStack_3ec = fVar191;
          }
        }
        iVar55 = movmskps(iVar55,auVar183);
        _local_2e8 = auVar180;
        if (iVar55 != 0) {
          fVar304 = (fVar320 - fVar304) * local_3e8 + fVar304;
          fVar247 = (fVar322 - fVar247) * fStack_3e4 + fVar247;
          fVar264 = (fVar324 - fVar264) * fStack_3e0 + fVar264;
          fVar275 = (fVar326 - fVar275) * fStack_3dc + fVar275;
          fVar171 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
          auVar102._0_4_ = -(uint)(fVar171 * (fVar304 + fVar304) < local_3f8) & auVar183._0_4_;
          auVar102._4_4_ = -(uint)(fVar171 * (fVar247 + fVar247) < fStack_3f4) & auVar183._4_4_;
          auVar102._8_4_ = -(uint)(fVar171 * (fVar264 + fVar264) < fStack_3f0) & auVar183._8_4_;
          auVar102._12_4_ = -(uint)(fVar171 * (fVar275 + fVar275) < fStack_3ec) & auVar183._12_4_;
          iVar55 = movmskps((int)local_3b0,auVar102);
          if (iVar55 != 0) {
            local_268 = local_268 + local_268 + -1.0;
            fStack_264 = fStack_264 + fStack_264 + -1.0;
            fStack_260 = fStack_260 + fStack_260 + -1.0;
            fStack_25c = fStack_25c + fStack_25c + -1.0;
            local_1d8 = 0;
            local_1c8 = CONCAT44(fStack_354,local_358);
            uStack_1c0 = CONCAT44(fStack_34c,fStack_350);
            local_1b8 = CONCAT44(fStack_364,local_368);
            uStack_1b0 = CONCAT44(fStack_35c,fStack_360);
            local_1a8 = CONCAT44(fStack_374,local_378);
            uStack_1a0 = CONCAT44(fStack_36c,fStack_370);
            local_198 = CONCAT44(fStack_344,local_348);
            uStack_190 = CONCAT44(fStack_33c,fStack_340);
            local_208 = local_3e8;
            fStack_204 = fStack_3e4;
            fStack_200 = fStack_3e0;
            fStack_1fc = fStack_3dc;
            local_1f8 = local_268;
            fStack_1f4 = fStack_264;
            fStack_1f0 = fStack_260;
            fStack_1ec = fStack_25c;
            local_1e8 = local_3f8;
            fStack_1e4 = fStack_3f4;
            fStack_1e0 = fStack_3f0;
            fStack_1dc = fStack_3ec;
            local_1d4 = iVar21;
            local_188 = auVar102;
            if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar77 = 1.0 / fVar77;
              local_178[0] = fVar77 * (local_3e8 + 0.0);
              local_178[1] = fVar77 * (fStack_3e4 + 1.0);
              local_178[2] = fVar77 * (fStack_3e0 + 2.0);
              local_178[3] = fVar77 * (fStack_3dc + 3.0);
              local_168 = CONCAT44(fStack_264,local_268);
              uStack_160 = CONCAT44(fStack_25c,fStack_260);
              local_158[0] = local_3f8;
              local_158[1] = fStack_3f4;
              local_158[2] = fStack_3f0;
              local_158[3] = fStack_3ec;
              auVar136._0_4_ = auVar102._0_4_ & (uint)local_3f8;
              auVar136._4_4_ = auVar102._4_4_ & (uint)fStack_3f4;
              auVar136._8_4_ = auVar102._8_4_ & (uint)fStack_3f0;
              auVar136._12_4_ = auVar102._12_4_ & (uint)fStack_3ec;
              auVar162._0_8_ = CONCAT44(~auVar102._4_4_,~auVar102._0_4_) & 0x7f8000007f800000;
              auVar162._8_4_ = ~auVar102._8_4_ & 0x7f800000;
              auVar162._12_4_ = ~auVar102._12_4_ & 0x7f800000;
              auVar162 = auVar162 | auVar136;
              auVar184._4_4_ = auVar162._0_4_;
              auVar184._0_4_ = auVar162._4_4_;
              auVar184._8_4_ = auVar162._12_4_;
              auVar184._12_4_ = auVar162._8_4_;
              auVar79 = minps(auVar184,auVar162);
              auVar137._0_8_ = auVar79._8_8_;
              auVar137._8_4_ = auVar79._0_4_;
              auVar137._12_4_ = auVar79._4_4_;
              auVar79 = minps(auVar137,auVar79);
              auVar138._0_8_ =
                   CONCAT44(-(uint)(auVar79._4_4_ == auVar162._4_4_) & auVar102._4_4_,
                            -(uint)(auVar79._0_4_ == auVar162._0_4_) & auVar102._0_4_);
              auVar138._8_4_ = -(uint)(auVar79._8_4_ == auVar162._8_4_) & auVar102._8_4_;
              auVar138._12_4_ = -(uint)(auVar79._12_4_ == auVar162._12_4_) & auVar102._12_4_;
              iVar55 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar138);
              auVar103 = auVar102;
              if (iVar55 != 0) {
                auVar103._8_4_ = auVar138._8_4_;
                auVar103._0_8_ = auVar138._0_8_;
                auVar103._12_4_ = auVar138._12_4_;
              }
              uVar73 = movmskps(iVar55,auVar103);
              lVar66 = 0;
              if (uVar73 != 0) {
                for (; (uVar73 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                }
              }
              local_3d8 = auVar102;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar171 = local_178[lVar66];
                fVar77 = 1.0 - fVar171;
                fVar153 = fVar171 * 3.0;
                fVar155 = ((fVar153 + 2.0) * (fVar77 + fVar77) + fVar77 * -3.0 * fVar77) * 0.5;
                fVar113 = (fVar77 * -2.0 * fVar171 + fVar171 * fVar171) * 0.5;
                fVar153 = (fVar171 * fVar153 + (fVar153 + -5.0) * (fVar171 + fVar171)) * 0.5;
                uVar56 = *(undefined4 *)((long)&local_168 + lVar66 * 4);
                fVar77 = (fVar171 * (fVar77 + fVar77) - fVar77 * fVar77) * 0.5;
                *(float *)(ray + k * 4 + 0x80) = local_158[lVar66];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar77 * local_358 +
                     fVar153 * local_368 + fVar155 * local_378 + fVar113 * local_348;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar77 * fStack_354 +
                     fVar153 * fStack_364 + fVar155 * fStack_374 + fVar113 * fStack_344;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar77 * fStack_350 +
                     fVar153 * fStack_360 + fVar155 * fStack_370 + fVar113 * fStack_340;
                *(float *)(ray + k * 4 + 0xf0) = fVar171;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar56;
                *(uint *)(ray + k * 4 + 0x110) = uVar71;
                *(uint *)(ray + k * 4 + 0x120) = uVar69;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                pRVar62 = (RTCIntersectArguments *)context;
              }
              else {
                local_4f8 = CONCAT44(uVar71,uVar71);
                auVar79 = *local_2c8;
                _local_508 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                while( true ) {
                  local_d8 = local_178[lVar66];
                  local_c8 = *(undefined4 *)((long)&local_168 + lVar66 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_158[lVar66];
                  fVar155 = 1.0 - local_d8;
                  fVar171 = local_d8 * 3.0;
                  fVar153 = ((fVar171 + 2.0) * (fVar155 + fVar155) + fVar155 * -3.0 * fVar155) * 0.5
                  ;
                  fVar77 = (local_d8 * local_d8 + fVar155 * -2.0 * local_d8) * 0.5;
                  fVar113 = (local_d8 * fVar171 + (fVar171 + -5.0) * (local_d8 + local_d8)) * 0.5;
                  local_318.context = context->user;
                  fVar171 = (local_d8 * (fVar155 + fVar155) - fVar155 * fVar155) * 0.5;
                  local_108._0_4_ =
                       fVar171 * local_358 +
                       fVar113 * local_368 + fVar153 * local_378 + fVar77 * local_348;
                  local_f8 = fVar171 * fStack_354 +
                             fVar113 * fStack_364 + fVar153 * fStack_374 + fVar77 * fStack_344;
                  local_e8 = fVar171 * fStack_350 +
                             fVar113 * fStack_360 + fVar153 * fStack_370 + fVar77 * fStack_340;
                  local_108._4_4_ = local_108._0_4_;
                  local_108._8_4_ = local_108._0_4_;
                  fStack_fc = (float)local_108._0_4_;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  local_b8 = local_4f8;
                  uStack_b0 = CONCAT44(uVar71,uVar71);
                  local_a8 = CONCAT44(uVar69,uVar69);
                  uStack_a0 = CONCAT44(uVar69,uVar69);
                  local_98 = (local_318.context)->instID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_88 = (local_318.context)->instPrimID[0];
                  uStack_84 = local_88;
                  uStack_80 = local_88;
                  uStack_7c = local_88;
                  local_318.valid = (int *)local_3c8;
                  pRVar62 = (RTCIntersectArguments *)pGVar22->userPtr;
                  local_318.hit = (RTCHitN *)local_108;
                  local_318.N = 4;
                  p_Var58 = pGVar22->intersectionFilterN;
                  auVar328._8_8_ = pGVar65;
                  auVar328._0_8_ = p_Var58;
                  local_3c8 = auVar79;
                  local_318.geometryUserPtr = pRVar62;
                  local_318.ray = (RTCRayN *)ray;
                  if (p_Var58 != (RTCFilterFunctionN)0x0) {
                    auVar328 = (*p_Var58)(&local_318);
                    ray = local_2c0;
                  }
                  pGVar65 = auVar328._8_8_;
                  auVar148._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                  auVar148._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar148._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                  auVar148._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                  uVar73 = movmskps(auVar328._0_4_,auVar148);
                  pRVar59 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                  if ((uVar73 ^ 0xf) == 0) {
                    auVar148 = auVar148 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar62 = context->args;
                    pRVar60 = (RTCIntersectArguments *)pRVar62->filter;
                    auVar54._8_8_ = pGVar65;
                    auVar54._0_8_ = pRVar60;
                    auVar329._8_8_ = pGVar65;
                    auVar329._0_8_ = pRVar60;
                    if ((pRVar60 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0 ||
                        (auVar329 = auVar54, ((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar329 = (*(code *)pRVar60)(&local_318);
                      ray = local_2c0;
                    }
                    pGVar65 = auVar329._8_8_;
                    auVar109._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                    auVar109._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar109._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                    auVar109._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                    auVar148 = auVar109 ^ _DAT_01f7ae20;
                    uVar73 = movmskps(auVar329._0_4_,auVar109);
                    pRVar59 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                    if ((uVar73 ^ 0xf) != 0) {
                      RVar26 = *(RTCFeatureFlags *)((long)local_318.hit + 4);
                      uVar73 = *(uint *)((long)local_318.hit + 8);
                      uVar70 = *(uint *)((long)((long)local_318.hit + 8) + 4);
                      *(uint *)(local_318.ray + 0xc0) =
                           ~auVar109._0_4_ & *(uint *)&(local_318.hit)->field_0x0 |
                           *(uint *)(local_318.ray + 0xc0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_318.ray + 0xc4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_318.ray + 0xc4) & auVar109._4_4_;
                      *(uint *)(local_318.ray + 200) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_318.ray + 200) & auVar109._8_4_;
                      *(uint *)(local_318.ray + 0xcc) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_318.ray + 0xcc) & auVar109._12_4_;
                      RVar26 = *(RTCFeatureFlags *)((long)((long)local_318.hit + 0x10) + 4);
                      uVar73 = *(uint *)((long)local_318.hit + 0x18);
                      uVar70 = *(uint *)((long)((long)local_318.hit + 0x18) + 4);
                      *(uint *)(local_318.ray + 0xd0) =
                           ~auVar109._0_4_ & *(uint *)((long)local_318.hit + 0x10) |
                           *(uint *)(local_318.ray + 0xd0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_318.ray + 0xd4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_318.ray + 0xd4) & auVar109._4_4_;
                      *(uint *)(local_318.ray + 0xd8) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_318.ray + 0xd8) & auVar109._8_4_;
                      *(uint *)(local_318.ray + 0xdc) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_318.ray + 0xdc) & auVar109._12_4_;
                      RVar26 = ((RTCIntersectArguments *)((long)local_318.hit + 0x20))->feature_mask
                      ;
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))->
                                         context;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_318.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_318.ray + 0xe0) =
                           ~auVar109._0_4_ &
                           ((RTCIntersectArguments *)((long)local_318.hit + 0x20))->flags |
                           *(uint *)(local_318.ray + 0xe0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_318.ray + 0xe4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_318.ray + 0xe4) & auVar109._4_4_;
                      *(uint *)(local_318.ray + 0xe8) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_318.ray + 0xe8) & auVar109._8_4_;
                      *(uint *)(local_318.ray + 0xec) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_318.ray + 0xec) & auVar109._12_4_;
                      RVar26 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))->
                                        filter + 4);
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))->
                                         intersect;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_318.hit + 0x20))->intersect + 4);
                      *(uint *)(local_318.ray + 0xf0) =
                           ~auVar109._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))->filter
                           | *(uint *)(local_318.ray + 0xf0) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_318.ray + 0xf4) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_318.ray + 0xf4) & auVar109._4_4_;
                      *(uint *)(local_318.ray + 0xf8) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_318.ray + 0xf8) & auVar109._8_4_;
                      *(uint *)(local_318.ray + 0xfc) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_318.ray + 0xfc) & auVar109._12_4_;
                      RVar26 = ((RTCIntersectArguments *)((long)local_318.hit + 0x40))->feature_mask
                      ;
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))->
                                         context;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_318.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_318.ray + 0x100) =
                           ~auVar109._0_4_ &
                           ((RTCIntersectArguments *)((long)local_318.hit + 0x40))->flags |
                           *(uint *)(local_318.ray + 0x100) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_318.ray + 0x104) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_318.ray + 0x104) & auVar109._4_4_;
                      *(uint *)(local_318.ray + 0x108) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_318.ray + 0x108) & auVar109._8_4_;
                      *(uint *)(local_318.ray + 0x10c) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_318.ray + 0x10c) & auVar109._12_4_;
                      RVar26 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))->
                                        filter + 4);
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))->
                                         intersect;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_318.hit + 0x40))->intersect + 4);
                      *(uint *)(local_318.ray + 0x110) =
                           *(uint *)(local_318.ray + 0x110) & auVar109._0_4_ |
                           ~auVar109._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))->filter
                      ;
                      *(RTCFeatureFlags *)(local_318.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_318.ray + 0x114) & auVar109._4_4_ |
                           ~auVar109._4_4_ & RVar26;
                      *(uint *)(local_318.ray + 0x118) =
                           *(uint *)(local_318.ray + 0x118) & auVar109._8_4_ |
                           ~auVar109._8_4_ & uVar73;
                      *(uint *)(local_318.ray + 0x11c) =
                           *(uint *)(local_318.ray + 0x11c) & auVar109._12_4_ |
                           ~auVar109._12_4_ & uVar70;
                      RVar26 = ((RTCIntersectArguments *)((long)local_318.hit + 0x60))->feature_mask
                      ;
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))->
                                         context;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_318.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_318.ray + 0x120) =
                           *(uint *)(local_318.ray + 0x120) & auVar109._0_4_ |
                           ~auVar109._0_4_ &
                           ((RTCIntersectArguments *)((long)local_318.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_318.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_318.ray + 0x124) & auVar109._4_4_ |
                           ~auVar109._4_4_ & RVar26;
                      *(uint *)(local_318.ray + 0x128) =
                           *(uint *)(local_318.ray + 0x128) & auVar109._8_4_ |
                           ~auVar109._8_4_ & uVar73;
                      *(uint *)(local_318.ray + 300) =
                           *(uint *)(local_318.ray + 300) & auVar109._12_4_ |
                           ~auVar109._12_4_ & uVar70;
                      RVar26 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))->
                                        filter + 4);
                      uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))->
                                         intersect;
                      uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_318.hit + 0x60))->intersect + 4);
                      *(uint *)(local_318.ray + 0x130) =
                           ~auVar109._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))->filter
                           | *(uint *)(local_318.ray + 0x130) & auVar109._0_4_;
                      *(RTCFeatureFlags *)(local_318.ray + 0x134) =
                           ~auVar109._4_4_ & RVar26 |
                           *(RTCFeatureFlags *)(local_318.ray + 0x134) & auVar109._4_4_;
                      *(uint *)(local_318.ray + 0x138) =
                           ~auVar109._8_4_ & uVar73 |
                           *(uint *)(local_318.ray + 0x138) & auVar109._8_4_;
                      *(uint *)(local_318.ray + 0x13c) =
                           ~auVar109._12_4_ & uVar70 |
                           *(uint *)(local_318.ray + 0x13c) & auVar109._12_4_;
                      auVar19._0_4_ = *(undefined4 *)(local_318.hit + 0x80);
                      auVar19._4_4_ = *(undefined4 *)(local_318.hit + 0x84);
                      auVar19._8_8_ = *(undefined8 *)(local_318.hit + 0x88);
                      *(undefined1 (*) [16])(local_318.ray + 0x140) =
                           ~auVar109 & auVar19 |
                           *(undefined1 (*) [16])(local_318.ray + 0x140) & auVar109;
                      pRVar59 = (RayHitK<4> *)local_318.ray;
                      pRVar62 = (RTCIntersectArguments *)local_318.hit;
                    }
                  }
                  auVar149._0_4_ = auVar148._0_4_ << 0x1f;
                  auVar149._4_4_ = auVar148._4_4_ << 0x1f;
                  auVar149._8_4_ = auVar148._8_4_ << 0x1f;
                  auVar149._12_4_ = auVar148._12_4_ << 0x1f;
                  iVar55 = movmskps((int)pRVar59,auVar149);
                  if (iVar55 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_508._0_4_;
                  }
                  else {
                    local_508._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_508._4_4_ = 0;
                    fStack_500 = 0.0;
                    uStack_4fc = 0;
                  }
                  *(undefined4 *)(local_3d8 + lVar66 * 4) = 0;
                  local_3d8._0_4_ = -(uint)(local_3f8 <= (float)local_508._0_4_) & local_3d8._0_4_;
                  local_3d8._4_4_ = -(uint)(fStack_3f4 <= (float)local_508._0_4_) & local_3d8._4_4_;
                  local_3d8._8_4_ = -(uint)(fStack_3f0 <= (float)local_508._0_4_) & local_3d8._8_4_;
                  local_3d8._12_4_ =
                       -(uint)(fStack_3ec <= (float)local_508._0_4_) & local_3d8._12_4_;
                  iVar55 = movmskps(iVar55,local_3d8);
                  if (iVar55 == 0) break;
                  auVar150._0_4_ = local_3d8._0_4_ & (uint)local_3f8;
                  auVar150._4_4_ = local_3d8._4_4_ & (uint)fStack_3f4;
                  auVar150._8_4_ = local_3d8._8_4_ & (uint)fStack_3f0;
                  auVar150._12_4_ = local_3d8._12_4_ & (uint)fStack_3ec;
                  auVar168._0_8_ = CONCAT44(~local_3d8._4_4_,~local_3d8._0_4_) & 0x7f8000007f800000;
                  auVar168._8_4_ = ~local_3d8._8_4_ & 0x7f800000;
                  auVar168._12_4_ = ~local_3d8._12_4_ & 0x7f800000;
                  auVar168 = auVar168 | auVar150;
                  auVar189._4_4_ = auVar168._0_4_;
                  auVar189._0_4_ = auVar168._4_4_;
                  auVar189._8_4_ = auVar168._12_4_;
                  auVar189._12_4_ = auVar168._8_4_;
                  auVar161 = minps(auVar189,auVar168);
                  auVar151._0_8_ = auVar161._8_8_;
                  auVar151._8_4_ = auVar161._0_4_;
                  auVar151._12_4_ = auVar161._4_4_;
                  auVar161 = minps(auVar151,auVar161);
                  auVar152._0_8_ =
                       CONCAT44(-(uint)(auVar161._4_4_ == auVar168._4_4_) & local_3d8._4_4_,
                                -(uint)(auVar161._0_4_ == auVar168._0_4_) & local_3d8._0_4_);
                  auVar152._8_4_ = -(uint)(auVar161._8_4_ == auVar168._8_4_) & local_3d8._8_4_;
                  auVar152._12_4_ = -(uint)(auVar161._12_4_ == auVar168._12_4_) & local_3d8._12_4_;
                  iVar55 = movmskps(iVar55,auVar152);
                  auVar110 = local_3d8;
                  if (iVar55 != 0) {
                    auVar110._8_4_ = auVar152._8_4_;
                    auVar110._0_8_ = auVar152._0_8_;
                    auVar110._12_4_ = auVar152._12_4_;
                  }
                  uVar56 = movmskps(iVar55,auVar110);
                  uVar61 = CONCAT44((int)((ulong)pRVar59 >> 0x20),uVar56);
                  lVar66 = 0;
                  if (uVar61 != 0) {
                    for (; (uVar61 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                    }
                  }
                }
              }
            }
          }
          uVar56 = SUB84(pRVar62,0);
        }
      }
      if (4 < iVar21) {
        local_58 = iVar21;
        iStack_54 = iVar21;
        iStack_50 = iVar21;
        iStack_4c = iVar21;
        local_2a8._4_4_ = local_2a8._0_4_;
        fStack_2a0 = (float)local_2a8._0_4_;
        fStack_29c = (float)local_2a8._0_4_;
        local_78 = 1.0 / (float)local_2b8._0_4_;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        local_2b8._4_4_ = uVar69;
        local_2b8._0_4_ = uVar69;
        local_2b8._8_4_ = uVar69;
        local_2b8._12_4_ = uVar69;
        local_68 = uVar71;
        uStack_64 = uVar71;
        uStack_60 = uVar71;
        uStack_5c = uVar71;
        lVar66 = 4;
        do {
          uVar70 = (uint)lVar66;
          pRVar62 = (RTCIntersectArguments *)(catmullrom_basis0 + lVar24);
          pfVar1 = (float *)((long)&pRVar62->flags + lVar66 * 4);
          fVar171 = *pfVar1;
          fVar77 = pfVar1[1];
          fVar113 = pfVar1[2];
          fVar153 = pfVar1[3];
          pauVar8 = (undefined1 (*) [16])(lVar24 + 0x21b37f0 + lVar66 * 4);
          fVar155 = *(float *)*pauVar8;
          fVar158 = *(float *)(*pauVar8 + 4);
          fVar169 = *(float *)(*pauVar8 + 8);
          auVar29 = *(undefined1 (*) [12])*pauVar8;
          fVar174 = *(float *)(*pauVar8 + 0xc);
          _local_2e8 = *pauVar8;
          pfVar1 = (float *)(lVar24 + 0x21b3c74 + lVar66 * 4);
          fVar190 = *pfVar1;
          fVar191 = pfVar1[1];
          fVar192 = pfVar1[2];
          fVar200 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21b40f8 + lVar66 * 4);
          fVar201 = *pfVar1;
          fVar229 = pfVar1[1];
          fVar233 = pfVar1[2];
          fVar234 = pfVar1[3];
          local_238 = local_228 * fVar171 +
                      local_328 * fVar155 + local_2d8 * fVar190 + fVar115 * fVar201;
          fStack_234 = fStack_224 * fVar77 +
                       fStack_324 * fVar158 + fStack_2d4 * fVar191 + fVar115 * fVar229;
          fStack_230 = fStack_220 * fVar113 +
                       fStack_320 * fVar169 + fStack_2d0 * fVar192 + fVar115 * fVar233;
          fStack_22c = fStack_21c * fVar153 +
                       fStack_31c * fVar174 + fStack_2cc * fVar200 + fVar115 * fVar234;
          local_248 = local_298 * fVar171 +
                      local_338 * fVar155 + fVar226 * fVar190 + fVar119 * fVar201;
          fStack_244 = fStack_294 * fVar77 +
                       fStack_334 * fVar158 + fVar226 * fVar191 + fVar119 * fVar229;
          fStack_240 = fStack_290 * fVar113 +
                       fStack_330 * fVar169 + fVar226 * fVar192 + fVar119 * fVar233;
          fStack_23c = fStack_28c * fVar153 +
                       fStack_32c * fVar174 + fVar226 * fVar200 + fVar119 * fVar234;
          auVar296._0_4_ =
               local_148 * fVar171 + local_138 * fVar155 + local_118 * fVar190 + local_128 * fVar201
          ;
          auVar296._4_4_ =
               fStack_144 * fVar77 +
               fStack_134 * fVar158 + fStack_114 * fVar191 + fStack_124 * fVar229;
          auVar296._8_4_ =
               fStack_140 * fVar113 +
               fStack_130 * fVar169 + fStack_110 * fVar192 + fStack_120 * fVar233;
          auVar296._12_4_ =
               fStack_13c * fVar153 +
               fStack_12c * fVar174 + fStack_10c * fVar200 + fStack_11c * fVar234;
          pfVar1 = (float *)(catmullrom_basis1 + lVar24 + lVar66 * 4);
          fVar155 = *pfVar1;
          fVar158 = pfVar1[1];
          fVar169 = pfVar1[2];
          fVar235 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21b5c10 + lVar66 * 4);
          fVar242 = *pfVar1;
          fVar243 = pfVar1[1];
          fVar251 = pfVar1[2];
          fVar259 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21b6094 + lVar66 * 4);
          fVar261 = *pfVar1;
          fVar304 = pfVar1[1];
          fVar244 = pfVar1[2];
          fVar247 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21b6518 + lVar66 * 4);
          fVar248 = *pfVar1;
          fVar264 = pfVar1[1];
          fVar273 = pfVar1[2];
          fVar275 = pfVar1[3];
          fVar305 = local_228 * fVar155 +
                    local_328 * fVar242 + local_2d8 * fVar261 + fVar115 * fVar248;
          fVar311 = fStack_224 * fVar158 +
                    fStack_324 * fVar243 + fStack_2d4 * fVar304 + fVar115 * fVar264;
          fVar312 = fStack_220 * fVar169 +
                    fStack_320 * fVar251 + fStack_2d0 * fVar244 + fVar115 * fVar273;
          fVar313 = fStack_21c * fVar235 +
                    fStack_31c * fVar259 + fStack_2cc * fVar247 + fVar115 * fVar275;
          fVar225 = local_298 * fVar155 +
                    local_338 * fVar242 + fVar226 * fVar261 + fVar119 * fVar248;
          fVar227 = fStack_294 * fVar158 +
                    fStack_334 * fVar243 + fVar226 * fVar304 + fVar119 * fVar264;
          fVar228 = fStack_290 * fVar169 +
                    fStack_330 * fVar251 + fVar226 * fVar244 + fVar119 * fVar273;
          fVar320 = fStack_28c * fVar235 +
                    fStack_32c * fVar259 + fVar226 * fVar247 + fVar119 * fVar275;
          auVar308._0_4_ =
               local_148 * fVar155 + local_138 * fVar242 + local_118 * fVar261 + local_128 * fVar248
          ;
          auVar308._4_4_ =
               fStack_144 * fVar158 +
               fStack_134 * fVar243 + fStack_114 * fVar304 + fStack_124 * fVar264;
          auVar308._8_4_ =
               fStack_140 * fVar169 +
               fStack_130 * fVar251 + fStack_110 * fVar244 + fStack_120 * fVar273;
          auVar308._12_4_ =
               fStack_13c * fVar235 +
               fStack_12c * fVar259 + fStack_10c * fVar247 + fStack_11c * fVar275;
          fVar288 = fVar305 - local_238;
          fVar298 = fVar311 - fStack_234;
          fVar300 = fVar312 - fStack_230;
          fVar302 = fVar313 - fStack_22c;
          fVar278 = fVar225 - local_248;
          fVar285 = fVar227 - fStack_244;
          fVar286 = fVar228 - fStack_240;
          fVar287 = fVar320 - fStack_23c;
          fVar322 = local_248 * fVar288 - local_238 * fVar278;
          fVar324 = fStack_244 * fVar298 - fStack_234 * fVar285;
          fVar326 = fStack_240 * fVar300 - fStack_230 * fVar286;
          fVar249 = fStack_23c * fVar302 - fStack_22c * fVar287;
          auVar79 = maxps(auVar296,auVar308);
          bVar52 = fVar322 * fVar322 <=
                   auVar79._0_4_ * auVar79._0_4_ * (fVar288 * fVar288 + fVar278 * fVar278) &&
                   (int)uVar70 < local_58;
          auVar241._0_4_ = -(uint)bVar52;
          bVar53 = fVar324 * fVar324 <=
                   auVar79._4_4_ * auVar79._4_4_ * (fVar298 * fVar298 + fVar285 * fVar285) &&
                   (int)(uVar70 | 1) < iStack_54;
          auVar241._4_4_ = -(uint)bVar53;
          bVar51 = fVar326 * fVar326 <=
                   auVar79._8_4_ * auVar79._8_4_ * (fVar300 * fVar300 + fVar286 * fVar286) &&
                   (int)(uVar70 | 2) < iStack_50;
          auVar241._8_4_ = -(uint)bVar51;
          bVar50 = fVar249 * fVar249 <=
                   auVar79._12_4_ * auVar79._12_4_ * (fVar302 * fVar302 + fVar287 * fVar287) &&
                   (int)(uVar70 | 3) < iStack_4c;
          auVar241._12_4_ = -(uint)bVar50;
          uVar73 = movmskps((int)pGVar65,auVar241);
          pGVar65 = (Geometry *)(ulong)uVar73;
          if (uVar73 != 0) {
            fVar249 = fVar248 * local_288 + fVar261 * local_278 + fVar242 * fVar224 +
                      fVar155 * fVar202;
            fVar250 = fVar264 * fStack_284 + fVar304 * fStack_274 + fVar243 * fVar224 +
                      fVar158 * fVar202;
            fVar252 = fVar273 * fStack_280 + fVar244 * fStack_270 + fVar251 * fVar224 +
                      fVar169 * fVar202;
            fVar260 = fVar275 * fStack_27c + fVar247 * fStack_26c + fVar259 * fVar224 +
                      fVar235 * fVar202;
            local_2e8._0_4_ = auVar29._0_4_;
            local_2e8._4_4_ = auVar29._4_4_;
            fStack_2e0 = auVar29._8_4_;
            fVar301 = fVar201 * local_288 + fVar190 * local_278 + (float)local_2e8._0_4_ * fVar224 +
                      fVar171 * fVar202;
            fVar303 = fVar229 * fStack_284 + fVar191 * fStack_274 + (float)local_2e8._4_4_ * fVar224
                      + fVar77 * fVar202;
            fVar78 = fVar233 * fStack_280 + fVar192 * fStack_270 + fStack_2e0 * fVar224 +
                     fVar113 * fVar202;
            fVar114 = fVar234 * fStack_27c + fVar200 * fStack_26c + fVar174 * fVar224 +
                      fVar153 * fVar202;
            pfVar1 = (float *)(lVar24 + 0x21b457c + lVar66 * 4);
            fVar171 = *pfVar1;
            fVar77 = pfVar1[1];
            fVar113 = pfVar1[2];
            fVar153 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b4a00 + lVar66 * 4);
            fVar155 = *pfVar1;
            fVar158 = pfVar1[1];
            fVar169 = pfVar1[2];
            fVar174 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b4e84 + lVar66 * 4);
            fVar190 = *pfVar1;
            fVar191 = pfVar1[1];
            fVar192 = pfVar1[2];
            fVar200 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b5308 + lVar66 * 4);
            fVar201 = *pfVar1;
            fVar229 = pfVar1[1];
            fVar233 = pfVar1[2];
            fVar234 = pfVar1[3];
            fVar116 = local_228 * fVar171 +
                      local_328 * fVar155 + local_2d8 * fVar190 + fVar115 * fVar201;
            fVar118 = fStack_224 * fVar77 +
                      fStack_324 * fVar158 + fStack_2d4 * fVar191 + fVar115 * fVar229;
            fVar120 = fStack_220 * fVar113 +
                      fStack_320 * fVar169 + fStack_2d0 * fVar192 + fVar115 * fVar233;
            fVar154 = fStack_21c * fVar153 +
                      fStack_31c * fVar174 + fStack_2cc * fVar200 + fVar115 * fVar234;
            fVar262 = local_298 * fVar171 +
                      local_338 * fVar155 + fVar226 * fVar190 + fVar119 * fVar201;
            fVar263 = fStack_294 * fVar77 +
                      fStack_334 * fVar158 + fVar226 * fVar191 + fVar119 * fVar229;
            fVar289 = fStack_290 * fVar113 +
                      fStack_330 * fVar169 + fVar226 * fVar192 + fVar119 * fVar233;
            fVar299 = fStack_28c * fVar153 +
                      fStack_32c * fVar174 + fVar226 * fVar200 + fVar119 * fVar234;
            pfVar1 = (float *)(lVar24 + 0x21b699c + lVar66 * 4);
            fVar235 = *pfVar1;
            fVar242 = pfVar1[1];
            fVar243 = pfVar1[2];
            fVar251 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b72a4 + lVar66 * 4);
            fVar259 = *pfVar1;
            fVar261 = pfVar1[1];
            fVar304 = pfVar1[2];
            fVar244 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b7728 + lVar66 * 4);
            fVar247 = *pfVar1;
            fVar248 = pfVar1[1];
            fVar264 = pfVar1[2];
            fVar273 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21b6e20 + lVar66 * 4);
            fVar275 = *pfVar1;
            fVar322 = pfVar1[1];
            fVar324 = pfVar1[2];
            fVar326 = pfVar1[3];
            fVar156 = local_228 * fVar235 +
                      local_328 * fVar275 + local_2d8 * fVar259 + fVar115 * fVar247;
            fVar157 = fStack_224 * fVar242 +
                      fStack_324 * fVar322 + fStack_2d4 * fVar261 + fVar115 * fVar248;
            fVar159 = fStack_220 * fVar243 +
                      fStack_320 * fVar324 + fStack_2d0 * fVar304 + fVar115 * fVar264;
            fVar170 = fStack_21c * fVar251 +
                      fStack_31c * fVar326 + fStack_2cc * fVar244 + fVar115 * fVar273;
            fVar172 = local_298 * fVar235 +
                      local_338 * fVar275 + fVar226 * fVar259 + fVar119 * fVar247;
            fVar173 = fStack_294 * fVar242 +
                      fStack_334 * fVar322 + fVar226 * fVar261 + fVar119 * fVar248;
            fVar265 = fStack_290 * fVar243 +
                      fStack_330 * fVar324 + fVar226 * fVar304 + fVar119 * fVar264;
            fVar274 = fStack_28c * fVar251 +
                      fStack_32c * fVar326 + fVar226 * fVar244 + fVar119 * fVar273;
            auVar297._0_8_ = CONCAT44(fVar118,fVar116) & 0x7fffffff7fffffff;
            auVar297._8_4_ = ABS(fVar120);
            auVar297._12_4_ = ABS(fVar154);
            auVar221._0_8_ = CONCAT44(fVar263,fVar262) & 0x7fffffff7fffffff;
            auVar221._8_4_ = ABS(fVar289);
            auVar221._12_4_ = ABS(fVar299);
            auVar79 = maxps(auVar297,auVar221);
            auVar309._0_8_ =
                 CONCAT44(fVar77 * fVar202 +
                          fVar158 * fVar224 + fVar191 * fStack_274 + fVar229 * fStack_284,
                          fVar171 * fVar202 +
                          fVar155 * fVar224 + fVar190 * local_278 + fVar201 * local_288) &
                 0x7fffffff7fffffff;
            auVar309._8_4_ =
                 ABS(fVar113 * fVar202 +
                     fVar169 * fVar224 + fVar192 * fStack_270 + fVar233 * fStack_280);
            auVar309._12_4_ =
                 ABS(fVar153 * fVar202 +
                     fVar174 * fVar224 + fVar200 * fStack_26c + fVar234 * fStack_27c);
            auVar79 = maxps(auVar79,auVar309);
            uVar73 = -(uint)(local_478 <= auVar79._0_4_);
            uVar72 = -(uint)(local_478 <= auVar79._4_4_);
            uVar74 = -(uint)(local_478 <= auVar79._8_4_);
            uVar75 = -(uint)(local_478 <= auVar79._12_4_);
            auVar222._0_4_ = ~uVar73 & (uint)fVar288;
            auVar222._4_4_ = ~uVar72 & (uint)fVar298;
            auVar222._8_4_ = ~uVar74 & (uint)fVar300;
            auVar222._12_4_ = ~uVar75 & (uint)fVar302;
            auVar284._0_4_ = (uint)fVar116 & uVar73;
            auVar284._4_4_ = (uint)fVar118 & uVar72;
            auVar284._8_4_ = (uint)fVar120 & uVar74;
            auVar284._12_4_ = (uint)fVar154 & uVar75;
            auVar284 = auVar284 | auVar222;
            fVar191 = (float)(~uVar73 & (uint)fVar278 | (uint)fVar262 & uVar73);
            fVar192 = (float)(~uVar72 & (uint)fVar285 | (uint)fVar263 & uVar72);
            fVar200 = (float)(~uVar74 & (uint)fVar286 | (uint)fVar289 & uVar74);
            fVar262 = (float)(~uVar75 & (uint)fVar287 | (uint)fVar299 & uVar75);
            auVar310._0_8_ = CONCAT44(fVar157,fVar156) & 0x7fffffff7fffffff;
            auVar310._8_4_ = ABS(fVar159);
            auVar310._12_4_ = ABS(fVar170);
            auVar163._0_8_ = CONCAT44(fVar173,fVar172) & 0x7fffffff7fffffff;
            auVar163._8_4_ = ABS(fVar265);
            auVar163._12_4_ = ABS(fVar274);
            auVar79 = maxps(auVar310,auVar163);
            auVar104._0_8_ =
                 CONCAT44(fVar242 * fVar202 +
                          fVar322 * fVar224 + fVar261 * fStack_274 + fVar248 * fStack_284,
                          fVar235 * fVar202 +
                          fVar275 * fVar224 + fVar259 * local_278 + fVar247 * local_288) &
                 0x7fffffff7fffffff;
            auVar104._8_4_ =
                 ABS(fVar243 * fVar202 +
                     fVar324 * fVar224 + fVar304 * fStack_270 + fVar264 * fStack_280);
            auVar104._12_4_ =
                 ABS(fVar251 * fVar202 +
                     fVar326 * fVar224 + fVar244 * fStack_26c + fVar273 * fStack_27c);
            auVar79 = maxps(auVar79,auVar104);
            uVar73 = -(uint)(local_478 <= auVar79._0_4_);
            uVar72 = -(uint)(local_478 <= auVar79._4_4_);
            uVar74 = -(uint)(local_478 <= auVar79._8_4_);
            uVar75 = -(uint)(local_478 <= auVar79._12_4_);
            fVar259 = (float)((uint)fVar156 & uVar73 | ~uVar73 & (uint)fVar288);
            fVar304 = (float)((uint)fVar157 & uVar72 | ~uVar72 & (uint)fVar298);
            fVar247 = (float)((uint)fVar159 & uVar74 | ~uVar74 & (uint)fVar300);
            fVar264 = (float)((uint)fVar170 & uVar75 | ~uVar75 & (uint)fVar302);
            fVar235 = (float)(~uVar73 & (uint)fVar278 | (uint)fVar172 & uVar73);
            fVar242 = (float)(~uVar72 & (uint)fVar285 | (uint)fVar173 & uVar72);
            fVar243 = (float)(~uVar74 & (uint)fVar286 | (uint)fVar265 & uVar74);
            fVar251 = (float)(~uVar75 & (uint)fVar287 | (uint)fVar274 & uVar75);
            fVar190 = auVar284._0_4_;
            fVar171 = auVar284._4_4_;
            fVar77 = auVar284._8_4_;
            fVar113 = auVar284._12_4_;
            auVar196._0_4_ = fVar191 * fVar191 + fVar190 * fVar190;
            auVar196._4_4_ = fVar192 * fVar192 + fVar171 * fVar171;
            auVar196._8_4_ = fVar200 * fVar200 + fVar77 * fVar77;
            auVar196._12_4_ = fVar262 * fVar262 + fVar113 * fVar113;
            auVar79 = rsqrtps(auVar222,auVar196);
            fVar153 = auVar79._0_4_;
            fVar155 = auVar79._4_4_;
            fVar158 = auVar79._8_4_;
            fVar169 = auVar79._12_4_;
            auVar223._0_4_ = fVar153 * fVar153 * auVar196._0_4_ * 0.5 * fVar153;
            auVar223._4_4_ = fVar155 * fVar155 * auVar196._4_4_ * 0.5 * fVar155;
            auVar223._8_4_ = fVar158 * fVar158 * auVar196._8_4_ * 0.5 * fVar158;
            auVar223._12_4_ = fVar169 * fVar169 * auVar196._12_4_ * 0.5 * fVar169;
            fVar201 = fVar153 * 1.5 - auVar223._0_4_;
            fVar229 = fVar155 * 1.5 - auVar223._4_4_;
            fVar233 = fVar158 * 1.5 - auVar223._8_4_;
            fVar234 = fVar169 * 1.5 - auVar223._12_4_;
            auVar197._0_4_ = fVar235 * fVar235 + fVar259 * fVar259;
            auVar197._4_4_ = fVar242 * fVar242 + fVar304 * fVar304;
            auVar197._8_4_ = fVar243 * fVar243 + fVar247 * fVar247;
            auVar197._12_4_ = fVar251 * fVar251 + fVar264 * fVar264;
            auVar79 = rsqrtps(auVar223,auVar197);
            fVar153 = auVar79._0_4_;
            fVar155 = auVar79._4_4_;
            fVar158 = auVar79._8_4_;
            fVar169 = auVar79._12_4_;
            fVar174 = fVar153 * 1.5 - fVar153 * fVar153 * auVar197._0_4_ * 0.5 * fVar153;
            fVar155 = fVar155 * 1.5 - fVar155 * fVar155 * auVar197._4_4_ * 0.5 * fVar155;
            fVar158 = fVar158 * 1.5 - fVar158 * fVar158 * auVar197._8_4_ * 0.5 * fVar158;
            fVar169 = fVar169 * 1.5 - fVar169 * fVar169 * auVar197._12_4_ * 0.5 * fVar169;
            fVar288 = fVar191 * fVar201 * auVar296._0_4_;
            fVar300 = fVar192 * fVar229 * auVar296._4_4_;
            fVar156 = fVar200 * fVar233 * auVar296._8_4_;
            fVar159 = fVar262 * fVar234 * auVar296._12_4_;
            fVar190 = -fVar190 * fVar201 * auVar296._0_4_;
            fVar191 = -fVar171 * fVar229 * auVar296._4_4_;
            fVar192 = -fVar77 * fVar233 * auVar296._8_4_;
            fVar200 = -fVar113 * fVar234 * auVar296._12_4_;
            fVar261 = fVar201 * 0.0 * auVar296._0_4_;
            fVar244 = fVar229 * 0.0 * auVar296._4_4_;
            fVar248 = fVar233 * 0.0 * auVar296._8_4_;
            fVar273 = fVar234 * 0.0 * auVar296._12_4_;
            fVar172 = fVar235 * fVar174 * auVar308._0_4_;
            fVar173 = fVar242 * fVar155 * auVar308._4_4_;
            fVar265 = fVar243 * fVar158 * auVar308._8_4_;
            fVar274 = fVar251 * fVar169 * auVar308._12_4_;
            fVar324 = fVar305 + fVar172;
            fVar326 = fVar311 + fVar173;
            fVar262 = fVar312 + fVar265;
            fVar263 = fVar313 + fVar274;
            fVar171 = -fVar259 * fVar174 * auVar308._0_4_;
            fVar77 = -fVar304 * fVar155 * auVar308._4_4_;
            fVar113 = -fVar247 * fVar158 * auVar308._8_4_;
            fVar153 = -fVar264 * fVar169 * auVar308._12_4_;
            fVar289 = fVar225 + fVar171;
            fVar299 = fVar227 + fVar77;
            fVar116 = fVar228 + fVar113;
            fVar118 = fVar320 + fVar153;
            fVar229 = fVar174 * 0.0 * auVar308._0_4_;
            fVar234 = fVar155 * 0.0 * auVar308._4_4_;
            fVar242 = fVar158 * 0.0 * auVar308._8_4_;
            fVar251 = fVar169 * 0.0 * auVar308._12_4_;
            fVar259 = local_238 - fVar288;
            fVar304 = fStack_234 - fVar300;
            fVar247 = fStack_230 - fVar156;
            fVar264 = fStack_22c - fVar159;
            fVar120 = fVar249 + fVar229;
            fVar154 = fVar250 + fVar234;
            fVar157 = fVar252 + fVar242;
            fVar170 = fVar260 + fVar251;
            fVar275 = local_248 - fVar190;
            fVar298 = fStack_244 - fVar191;
            fVar302 = fStack_240 - fVar192;
            fVar322 = fStack_23c - fVar200;
            fVar201 = fVar301 - fVar261;
            fVar233 = fVar303 - fVar244;
            fVar235 = fVar78 - fVar248;
            fVar243 = fVar114 - fVar273;
            uVar73 = -(uint)(0.0 < (fVar275 * (fVar120 - fVar201) - fVar201 * (fVar289 - fVar275)) *
                                   0.0 + (fVar201 * (fVar324 - fVar259) -
                                         (fVar120 - fVar201) * fVar259) * 0.0 +
                                         ((fVar289 - fVar275) * fVar259 -
                                         (fVar324 - fVar259) * fVar275));
            uVar72 = -(uint)(0.0 < (fVar298 * (fVar154 - fVar233) - fVar233 * (fVar299 - fVar298)) *
                                   0.0 + (fVar233 * (fVar326 - fVar304) -
                                         (fVar154 - fVar233) * fVar304) * 0.0 +
                                         ((fVar299 - fVar298) * fVar304 -
                                         (fVar326 - fVar304) * fVar298));
            uVar74 = -(uint)(0.0 < (fVar302 * (fVar157 - fVar235) - fVar235 * (fVar116 - fVar302)) *
                                   0.0 + (fVar235 * (fVar262 - fVar247) -
                                         (fVar157 - fVar235) * fVar247) * 0.0 +
                                         ((fVar116 - fVar302) * fVar247 -
                                         (fVar262 - fVar247) * fVar302));
            uVar75 = -(uint)(0.0 < (fVar322 * (fVar170 - fVar243) - fVar243 * (fVar118 - fVar322)) *
                                   0.0 + (fVar243 * (fVar263 - fVar264) -
                                         (fVar170 - fVar243) * fVar264) * 0.0 +
                                         ((fVar118 - fVar322) * fVar264 -
                                         (fVar263 - fVar264) * fVar322));
            fVar155 = (float)((uint)(fVar305 - fVar172) & uVar73 |
                             ~uVar73 & (uint)(local_238 + fVar288));
            fVar158 = (float)((uint)(fVar311 - fVar173) & uVar72 |
                             ~uVar72 & (uint)(fStack_234 + fVar300));
            fVar169 = (float)((uint)(fVar312 - fVar265) & uVar74 |
                             ~uVar74 & (uint)(fStack_230 + fVar156));
            fVar174 = (float)((uint)(fVar313 - fVar274) & uVar75 |
                             ~uVar75 & (uint)(fStack_22c + fVar159));
            fVar156 = (float)((uint)(fVar225 - fVar171) & uVar73 |
                             ~uVar73 & (uint)(local_248 + fVar190));
            fVar159 = (float)((uint)(fVar227 - fVar77) & uVar72 |
                             ~uVar72 & (uint)(fStack_244 + fVar191));
            fVar172 = (float)((uint)(fVar228 - fVar113) & uVar74 |
                             ~uVar74 & (uint)(fStack_240 + fVar192));
            fVar173 = (float)((uint)(fVar320 - fVar153) & uVar75 |
                             ~uVar75 & (uint)(fStack_23c + fVar200));
            fVar312 = (float)((uint)(fVar249 - fVar229) & uVar73 |
                             ~uVar73 & (uint)(fVar301 + fVar261));
            fVar313 = (float)((uint)(fVar250 - fVar234) & uVar72 |
                             ~uVar72 & (uint)(fVar303 + fVar244));
            fVar225 = (float)((uint)(fVar252 - fVar242) & uVar74 |
                             ~uVar74 & (uint)(fVar78 + fVar248));
            fVar227 = (float)((uint)(fVar260 - fVar251) & uVar75 |
                             ~uVar75 & (uint)(fVar114 + fVar273));
            fVar261 = (float)((uint)fVar259 & uVar73 | ~uVar73 & (uint)fVar324);
            fVar244 = (float)((uint)fVar304 & uVar72 | ~uVar72 & (uint)fVar326);
            fVar248 = (float)((uint)fVar247 & uVar74 | ~uVar74 & (uint)fVar262);
            fVar273 = (float)((uint)fVar264 & uVar75 | ~uVar75 & (uint)fVar263);
            fVar288 = (float)((uint)fVar275 & uVar73 | ~uVar73 & (uint)fVar289);
            fVar300 = (float)((uint)fVar298 & uVar72 | ~uVar72 & (uint)fVar299);
            fVar305 = (float)((uint)fVar302 & uVar74 | ~uVar74 & (uint)fVar116);
            fVar311 = (float)((uint)fVar322 & uVar75 | ~uVar75 & (uint)fVar118);
            fVar229 = (float)((uint)fVar201 & uVar73 | ~uVar73 & (uint)fVar120);
            fVar234 = (float)((uint)fVar233 & uVar72 | ~uVar72 & (uint)fVar154);
            fVar242 = (float)((uint)fVar235 & uVar74 | ~uVar74 & (uint)fVar157);
            fVar251 = (float)((uint)fVar243 & uVar75 | ~uVar75 & (uint)fVar170);
            fVar259 = (float)((uint)fVar324 & uVar73 | ~uVar73 & (uint)fVar259) - fVar155;
            fVar304 = (float)((uint)fVar326 & uVar72 | ~uVar72 & (uint)fVar304) - fVar158;
            fVar247 = (float)((uint)fVar262 & uVar74 | ~uVar74 & (uint)fVar247) - fVar169;
            fVar264 = (float)((uint)fVar263 & uVar75 | ~uVar75 & (uint)fVar264) - fVar174;
            fVar275 = (float)((uint)fVar289 & uVar73 | ~uVar73 & (uint)fVar275) - fVar156;
            fVar298 = (float)((uint)fVar299 & uVar72 | ~uVar72 & (uint)fVar298) - fVar159;
            fVar302 = (float)((uint)fVar116 & uVar74 | ~uVar74 & (uint)fVar302) - fVar172;
            fVar228 = (float)((uint)fVar118 & uVar75 | ~uVar75 & (uint)fVar322) - fVar173;
            fVar201 = (float)((uint)fVar120 & uVar73 | ~uVar73 & (uint)fVar201) - fVar312;
            fVar233 = (float)((uint)fVar154 & uVar72 | ~uVar72 & (uint)fVar233) - fVar313;
            fVar235 = (float)((uint)fVar157 & uVar74 | ~uVar74 & (uint)fVar235) - fVar225;
            fVar243 = (float)((uint)fVar170 & uVar75 | ~uVar75 & (uint)fVar243) - fVar227;
            fVar249 = fVar155 - fVar261;
            fVar250 = fVar158 - fVar244;
            fVar252 = fVar169 - fVar248;
            fVar260 = fVar174 - fVar273;
            fVar171 = fVar156 - fVar288;
            fVar77 = fVar159 - fVar300;
            fVar113 = fVar172 - fVar305;
            fVar153 = fVar173 - fVar311;
            fVar190 = fVar312 - fVar229;
            fVar191 = fVar313 - fVar234;
            fVar192 = fVar225 - fVar242;
            fVar200 = fVar227 - fVar251;
            fVar320 = (fVar156 * fVar201 - fVar312 * fVar275) * 0.0 +
                      (fVar312 * fVar259 - fVar155 * fVar201) * 0.0 +
                      (fVar155 * fVar275 - fVar156 * fVar259);
            fVar322 = (fVar159 * fVar233 - fVar313 * fVar298) * 0.0 +
                      (fVar313 * fVar304 - fVar158 * fVar233) * 0.0 +
                      (fVar158 * fVar298 - fVar159 * fVar304);
            auVar185._4_4_ = fVar322;
            auVar185._0_4_ = fVar320;
            fVar324 = (fVar172 * fVar235 - fVar225 * fVar302) * 0.0 +
                      (fVar225 * fVar247 - fVar169 * fVar235) * 0.0 +
                      (fVar169 * fVar302 - fVar172 * fVar247);
            fVar326 = (fVar173 * fVar243 - fVar227 * fVar228) * 0.0 +
                      (fVar227 * fVar264 - fVar174 * fVar243) * 0.0 +
                      (fVar174 * fVar228 - fVar173 * fVar264);
            auVar316._0_4_ =
                 (fVar288 * fVar190 - fVar229 * fVar171) * 0.0 +
                 (fVar229 * fVar249 - fVar261 * fVar190) * 0.0 +
                 (fVar261 * fVar171 - fVar288 * fVar249);
            auVar316._4_4_ =
                 (fVar300 * fVar191 - fVar234 * fVar77) * 0.0 +
                 (fVar234 * fVar250 - fVar244 * fVar191) * 0.0 +
                 (fVar244 * fVar77 - fVar300 * fVar250);
            auVar316._8_4_ =
                 (fVar305 * fVar192 - fVar242 * fVar113) * 0.0 +
                 (fVar242 * fVar252 - fVar248 * fVar192) * 0.0 +
                 (fVar248 * fVar113 - fVar305 * fVar252);
            auVar316._12_4_ =
                 (fVar311 * fVar200 - fVar251 * fVar153) * 0.0 +
                 (fVar251 * fVar260 - fVar273 * fVar200) * 0.0 +
                 (fVar273 * fVar153 - fVar311 * fVar260);
            auVar185._8_4_ = fVar324;
            auVar185._12_4_ = fVar326;
            auVar79 = maxps(auVar185,auVar316);
            bVar52 = auVar79._0_4_ <= 0.0 && bVar52;
            auVar186._0_4_ = -(uint)bVar52;
            bVar53 = auVar79._4_4_ <= 0.0 && bVar53;
            auVar186._4_4_ = -(uint)bVar53;
            bVar51 = auVar79._8_4_ <= 0.0 && bVar51;
            auVar186._8_4_ = -(uint)bVar51;
            bVar50 = auVar79._12_4_ <= 0.0 && bVar50;
            auVar186._12_4_ = -(uint)bVar50;
            iVar55 = movmskps((int)(catmullrom_basis1 + lVar24),auVar186);
            if (iVar55 == 0) {
              auVar165._8_8_ = uStack_380;
              auVar165._0_8_ = local_388;
              iVar55 = 0;
            }
            else {
              fVar229 = fVar171 * fVar201 - fVar190 * fVar275;
              fVar234 = fVar77 * fVar233 - fVar191 * fVar298;
              fVar242 = fVar113 * fVar235 - fVar192 * fVar302;
              fVar251 = fVar153 * fVar243 - fVar200 * fVar228;
              fVar201 = fVar190 * fVar259 - fVar201 * fVar249;
              fVar191 = fVar191 * fVar304 - fVar233 * fVar250;
              fVar192 = fVar192 * fVar247 - fVar235 * fVar252;
              fVar200 = fVar200 * fVar264 - fVar243 * fVar260;
              fVar171 = fVar249 * fVar275 - fVar171 * fVar259;
              fVar233 = fVar250 * fVar298 - fVar77 * fVar304;
              fVar235 = fVar252 * fVar302 - fVar113 * fVar247;
              fVar243 = fVar260 * fVar228 - fVar153 * fVar264;
              auVar164._0_4_ = fVar201 * 0.0 + fVar171;
              auVar164._4_4_ = fVar191 * 0.0 + fVar233;
              auVar164._8_4_ = fVar192 * 0.0 + fVar235;
              auVar164._12_4_ = fVar200 * 0.0 + fVar243;
              auVar232._0_4_ = fVar229 * 0.0 + auVar164._0_4_;
              auVar232._4_4_ = fVar234 * 0.0 + auVar164._4_4_;
              auVar232._8_4_ = fVar242 * 0.0 + auVar164._8_4_;
              auVar232._12_4_ = fVar251 * 0.0 + auVar164._12_4_;
              auVar79 = rcpps(auVar164,auVar232);
              fVar77 = auVar79._0_4_;
              fVar113 = auVar79._4_4_;
              fVar153 = auVar79._8_4_;
              fVar190 = auVar79._12_4_;
              fVar77 = (1.0 - auVar232._0_4_ * fVar77) * fVar77 + fVar77;
              fVar113 = (1.0 - auVar232._4_4_ * fVar113) * fVar113 + fVar113;
              fVar153 = (1.0 - auVar232._8_4_ * fVar153) * fVar153 + fVar153;
              fVar190 = (1.0 - auVar232._12_4_ * fVar190) * fVar190 + fVar190;
              fVar155 = (fVar312 * fVar171 + fVar156 * fVar201 + fVar155 * fVar229) * fVar77;
              fVar158 = (fVar313 * fVar233 + fVar159 * fVar191 + fVar158 * fVar234) * fVar113;
              fVar169 = (fVar225 * fVar235 + fVar172 * fVar192 + fVar169 * fVar242) * fVar153;
              fVar174 = (fVar227 * fVar243 + fVar173 * fVar200 + fVar174 * fVar251) * fVar190;
              fVar171 = *(float *)(ray + k * 4 + 0x80);
              bVar52 = (fVar155 <= fVar171 && (float)local_2a8._0_4_ <= fVar155) && bVar52;
              auVar198._0_4_ = -(uint)bVar52;
              bVar53 = (fVar158 <= fVar171 && (float)local_2a8._4_4_ <= fVar158) && bVar53;
              auVar198._4_4_ = -(uint)bVar53;
              bVar51 = (fVar169 <= fVar171 && fStack_2a0 <= fVar169) && bVar51;
              auVar198._8_4_ = -(uint)bVar51;
              bVar50 = (fVar174 <= fVar171 && fStack_29c <= fVar174) && bVar50;
              auVar198._12_4_ = -(uint)bVar50;
              iVar55 = movmskps(iVar55,auVar198);
              if (iVar55 == 0) {
                auVar165._8_8_ = uStack_380;
                auVar165._0_8_ = local_388;
                iVar55 = 0;
              }
              else {
                auVar199._0_8_ =
                     CONCAT44(-(uint)(auVar232._4_4_ != 0.0 && bVar53),
                              -(uint)(auVar232._0_4_ != 0.0 && bVar52));
                auVar199._8_4_ = -(uint)(auVar232._8_4_ != 0.0 && bVar51);
                auVar199._12_4_ = -(uint)(auVar232._12_4_ != 0.0 && bVar50);
                iVar55 = movmskps(iVar55,auVar199);
                auVar165._8_8_ = uStack_380;
                auVar165._0_8_ = local_388;
                if (iVar55 != 0) {
                  fVar320 = fVar320 * fVar77;
                  fVar322 = fVar322 * fVar113;
                  fVar324 = fVar324 * fVar153;
                  fVar326 = fVar326 * fVar190;
                  local_398 = (float)((uint)(1.0 - fVar320) & uVar73 | ~uVar73 & (uint)fVar320);
                  fStack_394 = (float)((uint)(1.0 - fVar322) & uVar72 | ~uVar72 & (uint)fVar322);
                  fStack_390 = (float)((uint)(1.0 - fVar324) & uVar74 | ~uVar74 & (uint)fVar324);
                  fStack_38c = (float)((uint)(1.0 - fVar326) & uVar75 | ~uVar75 & (uint)fVar326);
                  local_3a8 = (float)(~uVar73 & (uint)(auVar316._0_4_ * fVar77) |
                                     (uint)(1.0 - auVar316._0_4_ * fVar77) & uVar73);
                  fStack_3a4 = (float)(~uVar72 & (uint)(auVar316._4_4_ * fVar113) |
                                      (uint)(1.0 - auVar316._4_4_ * fVar113) & uVar72);
                  fStack_3a0 = (float)(~uVar74 & (uint)(auVar316._8_4_ * fVar153) |
                                      (uint)(1.0 - auVar316._8_4_ * fVar153) & uVar74);
                  fStack_39c = (float)(~uVar75 & (uint)(auVar316._12_4_ * fVar190) |
                                      (uint)(1.0 - auVar316._12_4_ * fVar190) & uVar75);
                  auVar165._8_4_ = auVar199._8_4_;
                  auVar165._0_8_ = auVar199._0_8_;
                  auVar165._12_4_ = auVar199._12_4_;
                  local_448 = fVar155;
                  fStack_444 = fVar158;
                  fStack_440 = fVar169;
                  fStack_43c = fVar174;
                }
              }
            }
            iVar55 = movmskps(iVar55,auVar165);
            local_258 = fVar278;
            fStack_254 = fVar285;
            fStack_250 = fVar286;
            fStack_24c = fVar287;
            if (iVar55 != 0) {
              fVar77 = (auVar308._0_4_ - auVar296._0_4_) * local_398 + auVar296._0_4_;
              fVar113 = (auVar308._4_4_ - auVar296._4_4_) * fStack_394 + auVar296._4_4_;
              fVar153 = (auVar308._8_4_ - auVar296._8_4_) * fStack_390 + auVar296._8_4_;
              fVar155 = (auVar308._12_4_ - auVar296._12_4_) * fStack_38c + auVar296._12_4_;
              fVar171 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
              auVar105._0_4_ = -(uint)(fVar171 * (fVar77 + fVar77) < local_448) & auVar165._0_4_;
              auVar105._4_4_ = -(uint)(fVar171 * (fVar113 + fVar113) < fStack_444) & auVar165._4_4_;
              auVar105._8_4_ = -(uint)(fVar171 * (fVar153 + fVar153) < fStack_440) & auVar165._8_4_;
              auVar105._12_4_ =
                   -(uint)(fVar171 * (fVar155 + fVar155) < fStack_43c) & auVar165._12_4_;
              iVar55 = movmskps((int)local_3b0,auVar105);
              if (iVar55 != 0) {
                local_3a8 = local_3a8 + local_3a8 + -1.0;
                fStack_3a4 = fStack_3a4 + fStack_3a4 + -1.0;
                fStack_3a0 = fStack_3a0 + fStack_3a0 + -1.0;
                fStack_39c = fStack_39c + fStack_39c + -1.0;
                local_1c8 = CONCAT44(fStack_354,local_358);
                uStack_1c0 = CONCAT44(fStack_34c,fStack_350);
                local_1b8 = CONCAT44(fStack_364,local_368);
                uStack_1b0 = CONCAT44(fStack_35c,fStack_360);
                local_1a8 = CONCAT44(fStack_374,local_378);
                uStack_1a0 = CONCAT44(fStack_36c,fStack_370);
                local_198 = CONCAT44(fStack_344,local_348);
                uStack_190 = CONCAT44(fStack_33c,fStack_340);
                pGVar65 = (context->scene->geometries).items[(long)pRVar64].ptr;
                pRVar62 = pRVar64;
                local_208 = local_398;
                fStack_204 = fStack_394;
                fStack_200 = fStack_390;
                fStack_1fc = fStack_38c;
                local_1f8 = local_3a8;
                fStack_1f4 = fStack_3a4;
                fStack_1f0 = fStack_3a0;
                fStack_1ec = fStack_39c;
                local_1e8 = local_448;
                fStack_1e4 = fStack_444;
                fStack_1e0 = fStack_440;
                fStack_1dc = fStack_43c;
                local_1d8 = uVar70;
                local_1d4 = iVar21;
                local_188 = auVar105;
                if ((pGVar65->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar171 = (float)(int)uVar70;
                  local_178[0] = (fVar171 + local_398 + 0.0) * local_78;
                  local_178[1] = (fVar171 + fStack_394 + 1.0) * fStack_74;
                  local_178[2] = (fVar171 + fStack_390 + 2.0) * fStack_70;
                  local_178[3] = (fVar171 + fStack_38c + 3.0) * fStack_6c;
                  local_168 = CONCAT44(fStack_3a4,local_3a8);
                  uStack_160 = CONCAT44(fStack_39c,fStack_3a0);
                  local_158[0] = local_448;
                  local_158[1] = fStack_444;
                  local_158[2] = fStack_440;
                  local_158[3] = fStack_43c;
                  auVar140._0_4_ = auVar105._0_4_ & (uint)local_448;
                  auVar140._4_4_ = auVar105._4_4_ & (uint)fStack_444;
                  auVar140._8_4_ = auVar105._8_4_ & (uint)fStack_440;
                  auVar140._12_4_ = auVar105._12_4_ & (uint)fStack_43c;
                  auVar166._0_8_ = CONCAT44(~auVar105._4_4_,~auVar105._0_4_) & 0x7f8000007f800000;
                  auVar166._8_4_ = ~auVar105._8_4_ & 0x7f800000;
                  auVar166._12_4_ = ~auVar105._12_4_ & 0x7f800000;
                  auVar166 = auVar166 | auVar140;
                  auVar187._4_4_ = auVar166._0_4_;
                  auVar187._0_4_ = auVar166._4_4_;
                  auVar187._8_4_ = auVar166._12_4_;
                  auVar187._12_4_ = auVar166._8_4_;
                  auVar79 = minps(auVar187,auVar166);
                  auVar141._0_8_ = auVar79._8_8_;
                  auVar141._8_4_ = auVar79._0_4_;
                  auVar141._12_4_ = auVar79._4_4_;
                  auVar79 = minps(auVar141,auVar79);
                  auVar142._0_8_ =
                       CONCAT44(-(uint)(auVar79._4_4_ == auVar166._4_4_) & auVar105._4_4_,
                                -(uint)(auVar79._0_4_ == auVar166._0_4_) & auVar105._0_4_);
                  auVar142._8_4_ = -(uint)(auVar79._8_4_ == auVar166._8_4_) & auVar105._8_4_;
                  auVar142._12_4_ = -(uint)(auVar79._12_4_ == auVar166._12_4_) & auVar105._12_4_;
                  iVar55 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar142);
                  auVar106 = auVar105;
                  if (iVar55 != 0) {
                    auVar106._8_4_ = auVar142._8_4_;
                    auVar106._0_8_ = auVar142._0_8_;
                    auVar106._12_4_ = auVar142._12_4_;
                  }
                  uVar73 = movmskps(iVar55,auVar106);
                  lVar67 = 0;
                  if (uVar73 != 0) {
                    for (; (uVar73 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                    }
                  }
                  local_3d8 = auVar105;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar65->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar171 = local_178[lVar67];
                    fVar77 = 1.0 - fVar171;
                    fVar153 = fVar171 * 3.0;
                    fVar155 = ((fVar153 + 2.0) * (fVar77 + fVar77) + fVar77 * -3.0 * fVar77) * 0.5;
                    fVar113 = (fVar77 * -2.0 * fVar171 + fVar171 * fVar171) * 0.5;
                    fVar153 = (fVar171 * fVar153 + (fVar153 + -5.0) * (fVar171 + fVar171)) * 0.5;
                    uVar56 = *(undefined4 *)((long)&local_168 + lVar67 * 4);
                    fVar77 = (fVar171 * (fVar77 + fVar77) - fVar77 * fVar77) * 0.5;
                    *(float *)(ray + k * 4 + 0x80) = local_158[lVar67];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar77 * local_358 +
                         fVar153 * local_368 + fVar155 * local_378 + fVar113 * local_348;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar77 * fStack_354 +
                         fVar153 * fStack_364 + fVar155 * fStack_374 + fVar113 * fStack_344;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar77 * fStack_350 +
                         fVar153 * fStack_360 + fVar155 * fStack_370 + fVar113 * fStack_340;
                    *(float *)(ray + k * 4 + 0xf0) = fVar171;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar56;
                    *(uint *)(ray + k * 4 + 0x110) = uVar71;
                    *(uint *)(ray + k * 4 + 0x120) = uVar69;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    pRVar62 = (RTCIntersectArguments *)context;
                  }
                  else {
                    auVar29 = *(undefined1 (*) [12])*local_2c8;
                    uStack_4cc = (undefined4)((ulong)*(undefined8 *)(*local_2c8 + 8) >> 0x20);
                    _local_508 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    while( true ) {
                      local_d8 = local_178[lVar67];
                      local_c8 = *(undefined4 *)((long)&local_168 + lVar67 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_158[lVar67];
                      fVar155 = 1.0 - local_d8;
                      fVar171 = local_d8 * 3.0;
                      fVar153 = ((fVar171 + 2.0) * (fVar155 + fVar155) + fVar155 * -3.0 * fVar155) *
                                0.5;
                      fVar77 = (local_d8 * local_d8 + fVar155 * -2.0 * local_d8) * 0.5;
                      fVar113 = (local_d8 * fVar171 + (fVar171 + -5.0) * (local_d8 + local_d8)) *
                                0.5;
                      local_318.context = context->user;
                      fVar171 = (local_d8 * (fVar155 + fVar155) - fVar155 * fVar155) * 0.5;
                      local_108._0_4_ =
                           fVar171 * local_358 +
                           fVar113 * local_368 + fVar153 * local_378 + fVar77 * local_348;
                      local_f8 = fVar171 * fStack_354 +
                                 fVar113 * fStack_364 + fVar153 * fStack_374 + fVar77 * fStack_344;
                      local_e8 = fVar171 * fStack_350 +
                                 fVar113 * fStack_360 + fVar153 * fStack_370 + fVar77 * fStack_340;
                      local_108._4_4_ = local_108._0_4_;
                      local_108._8_4_ = local_108._0_4_;
                      fStack_fc = (float)local_108._0_4_;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      fStack_d4 = local_d8;
                      fStack_d0 = local_d8;
                      fStack_cc = local_d8;
                      uStack_c4 = local_c8;
                      uStack_c0 = local_c8;
                      uStack_bc = local_c8;
                      local_b8 = CONCAT44(uStack_64,local_68);
                      uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                      local_a8 = local_2b8._0_8_;
                      uStack_a0 = local_2b8._8_8_;
                      local_98 = (local_318.context)->instID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_88 = (local_318.context)->instPrimID[0];
                      uStack_84 = local_88;
                      uStack_80 = local_88;
                      uStack_7c = local_88;
                      local_3c8._12_4_ = uStack_4cc;
                      local_3c8._0_12_ = auVar29;
                      local_318.valid = (int *)local_3c8;
                      pRVar62 = (RTCIntersectArguments *)pGVar65->userPtr;
                      local_318.hit = (RTCHitN *)local_108;
                      local_318.N = 4;
                      p_Var58 = pGVar65->intersectionFilterN;
                      local_318.geometryUserPtr = pRVar62;
                      local_318.ray = (RTCRayN *)ray;
                      if (p_Var58 != (RTCFilterFunctionN)0x0) {
                        p_Var58 = (RTCFilterFunctionN)(*p_Var58)(&local_318);
                      }
                      auVar143._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                      auVar143._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                      auVar143._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                      auVar143._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                      uVar73 = movmskps((int)p_Var58,auVar143);
                      pRVar59 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                      if ((uVar73 ^ 0xf) == 0) {
                        auVar143 = auVar143 ^ _DAT_01f7ae20;
                      }
                      else {
                        pRVar62 = context->args;
                        pRVar60 = (RTCIntersectArguments *)pRVar62->filter;
                        if ((pRVar60 != (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0 ||
                            (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar60 = (RTCIntersectArguments *)(*(code *)pRVar60)(&local_318);
                        }
                        auVar107._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                        auVar107._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                        auVar107._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                        auVar107._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                        auVar143 = auVar107 ^ _DAT_01f7ae20;
                        uVar73 = movmskps((int)pRVar60,auVar107);
                        pRVar59 = (RayHitK<4> *)(ulong)(uVar73 ^ 0xf);
                        if ((uVar73 ^ 0xf) != 0) {
                          RVar26 = *(RTCFeatureFlags *)((long)local_318.hit + 4);
                          uVar73 = *(uint *)((long)local_318.hit + 8);
                          uVar70 = *(uint *)((long)((long)local_318.hit + 8) + 4);
                          *(uint *)(local_318.ray + 0xc0) =
                               ~auVar107._0_4_ & *(uint *)&(local_318.hit)->field_0x0 |
                               *(uint *)(local_318.ray + 0xc0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_318.ray + 0xc4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_318.ray + 0xc4) & auVar107._4_4_;
                          *(uint *)(local_318.ray + 200) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_318.ray + 200) & auVar107._8_4_;
                          *(uint *)(local_318.ray + 0xcc) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_318.ray + 0xcc) & auVar107._12_4_;
                          RVar26 = *(RTCFeatureFlags *)((long)((long)local_318.hit + 0x10) + 4);
                          uVar73 = *(uint *)((long)local_318.hit + 0x18);
                          uVar70 = *(uint *)((long)((long)local_318.hit + 0x18) + 4);
                          *(uint *)(local_318.ray + 0xd0) =
                               ~auVar107._0_4_ & *(uint *)((long)local_318.hit + 0x10) |
                               *(uint *)(local_318.ray + 0xd0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_318.ray + 0xd4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_318.ray + 0xd4) & auVar107._4_4_;
                          *(uint *)(local_318.ray + 0xd8) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_318.ray + 0xd8) & auVar107._8_4_;
                          *(uint *)(local_318.ray + 0xdc) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_318.ray + 0xdc) & auVar107._12_4_;
                          RVar26 = ((RTCIntersectArguments *)((long)local_318.hit + 0x20))->
                                   feature_mask;
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))
                                             ->context;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_318.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_318.ray + 0xe0) =
                               ~auVar107._0_4_ &
                               ((RTCIntersectArguments *)((long)local_318.hit + 0x20))->flags |
                               *(uint *)(local_318.ray + 0xe0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_318.ray + 0xe4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_318.ray + 0xe4) & auVar107._4_4_;
                          *(uint *)(local_318.ray + 0xe8) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_318.ray + 0xe8) & auVar107._8_4_;
                          *(uint *)(local_318.ray + 0xec) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_318.ray + 0xec) & auVar107._12_4_;
                          RVar26 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))
                                            ->filter + 4);
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))
                                             ->intersect;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_318.hit + 0x20))->intersect + 4);
                          *(uint *)(local_318.ray + 0xf0) =
                               ~auVar107._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x20))->
                                         filter | *(uint *)(local_318.ray + 0xf0) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_318.ray + 0xf4) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_318.ray + 0xf4) & auVar107._4_4_;
                          *(uint *)(local_318.ray + 0xf8) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_318.ray + 0xf8) & auVar107._8_4_;
                          *(uint *)(local_318.ray + 0xfc) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_318.ray + 0xfc) & auVar107._12_4_;
                          RVar26 = ((RTCIntersectArguments *)((long)local_318.hit + 0x40))->
                                   feature_mask;
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))
                                             ->context;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_318.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_318.ray + 0x100) =
                               ~auVar107._0_4_ &
                               ((RTCIntersectArguments *)((long)local_318.hit + 0x40))->flags |
                               *(uint *)(local_318.ray + 0x100) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_318.ray + 0x104) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_318.ray + 0x104) & auVar107._4_4_;
                          *(uint *)(local_318.ray + 0x108) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_318.ray + 0x108) & auVar107._8_4_;
                          *(uint *)(local_318.ray + 0x10c) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_318.ray + 0x10c) & auVar107._12_4_;
                          RVar26 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))
                                            ->filter + 4);
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))
                                             ->intersect;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_318.hit + 0x40))->intersect + 4);
                          *(uint *)(local_318.ray + 0x110) =
                               *(uint *)(local_318.ray + 0x110) & auVar107._0_4_ |
                               ~auVar107._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x40))->
                                         filter;
                          *(RTCFeatureFlags *)(local_318.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_318.ray + 0x114) & auVar107._4_4_ |
                               ~auVar107._4_4_ & RVar26;
                          *(uint *)(local_318.ray + 0x118) =
                               *(uint *)(local_318.ray + 0x118) & auVar107._8_4_ |
                               ~auVar107._8_4_ & uVar73;
                          *(uint *)(local_318.ray + 0x11c) =
                               *(uint *)(local_318.ray + 0x11c) & auVar107._12_4_ |
                               ~auVar107._12_4_ & uVar70;
                          RVar26 = ((RTCIntersectArguments *)((long)local_318.hit + 0x60))->
                                   feature_mask;
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))
                                             ->context;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_318.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_318.ray + 0x120) =
                               *(uint *)(local_318.ray + 0x120) & auVar107._0_4_ |
                               ~auVar107._0_4_ &
                               ((RTCIntersectArguments *)((long)local_318.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_318.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_318.ray + 0x124) & auVar107._4_4_ |
                               ~auVar107._4_4_ & RVar26;
                          *(uint *)(local_318.ray + 0x128) =
                               *(uint *)(local_318.ray + 0x128) & auVar107._8_4_ |
                               ~auVar107._8_4_ & uVar73;
                          *(uint *)(local_318.ray + 300) =
                               *(uint *)(local_318.ray + 300) & auVar107._12_4_ |
                               ~auVar107._12_4_ & uVar70;
                          RVar26 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))
                                            ->filter + 4);
                          uVar73 = *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))
                                             ->intersect;
                          uVar70 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_318.hit + 0x60))->intersect + 4);
                          *(uint *)(local_318.ray + 0x130) =
                               ~auVar107._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_318.hit + 0x60))->
                                         filter | *(uint *)(local_318.ray + 0x130) & auVar107._0_4_;
                          *(RTCFeatureFlags *)(local_318.ray + 0x134) =
                               ~auVar107._4_4_ & RVar26 |
                               *(RTCFeatureFlags *)(local_318.ray + 0x134) & auVar107._4_4_;
                          *(uint *)(local_318.ray + 0x138) =
                               ~auVar107._8_4_ & uVar73 |
                               *(uint *)(local_318.ray + 0x138) & auVar107._8_4_;
                          *(uint *)(local_318.ray + 0x13c) =
                               ~auVar107._12_4_ & uVar70 |
                               *(uint *)(local_318.ray + 0x13c) & auVar107._12_4_;
                          auVar18._0_4_ = *(undefined4 *)(local_318.hit + 0x80);
                          auVar18._4_4_ = *(undefined4 *)(local_318.hit + 0x84);
                          auVar18._8_8_ = *(undefined8 *)(local_318.hit + 0x88);
                          *(undefined1 (*) [16])(local_318.ray + 0x140) =
                               ~auVar107 & auVar18 |
                               *(undefined1 (*) [16])(local_318.ray + 0x140) & auVar107;
                          pRVar59 = (RayHitK<4> *)local_318.ray;
                          pRVar62 = (RTCIntersectArguments *)local_318.hit;
                        }
                      }
                      auVar144._0_4_ = auVar143._0_4_ << 0x1f;
                      auVar144._4_4_ = auVar143._4_4_ << 0x1f;
                      auVar144._8_4_ = auVar143._8_4_ << 0x1f;
                      auVar144._12_4_ = auVar143._12_4_ << 0x1f;
                      iVar55 = movmskps((int)pRVar59,auVar144);
                      if (iVar55 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_508._0_4_;
                      }
                      else {
                        local_508._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_508._4_4_ = 0;
                        fStack_500 = 0.0;
                        uStack_4fc = 0;
                      }
                      *(undefined4 *)(local_3d8 + lVar67 * 4) = 0;
                      local_3d8._0_4_ =
                           -(uint)(local_448 <= (float)local_508._0_4_) & local_3d8._0_4_;
                      local_3d8._4_4_ =
                           -(uint)(fStack_444 <= (float)local_508._0_4_) & local_3d8._4_4_;
                      local_3d8._8_4_ =
                           -(uint)(fStack_440 <= (float)local_508._0_4_) & local_3d8._8_4_;
                      local_3d8._12_4_ =
                           -(uint)(fStack_43c <= (float)local_508._0_4_) & local_3d8._12_4_;
                      iVar55 = movmskps(iVar55,local_3d8);
                      if (iVar55 == 0) break;
                      auVar145._0_4_ = local_3d8._0_4_ & (uint)local_448;
                      auVar145._4_4_ = local_3d8._4_4_ & (uint)fStack_444;
                      auVar145._8_4_ = local_3d8._8_4_ & (uint)fStack_440;
                      auVar145._12_4_ = local_3d8._12_4_ & (uint)fStack_43c;
                      auVar167._0_8_ =
                           CONCAT44(~local_3d8._4_4_,~local_3d8._0_4_) & 0x7f8000007f800000;
                      auVar167._8_4_ = ~local_3d8._8_4_ & 0x7f800000;
                      auVar167._12_4_ = ~local_3d8._12_4_ & 0x7f800000;
                      auVar167 = auVar167 | auVar145;
                      auVar188._4_4_ = auVar167._0_4_;
                      auVar188._0_4_ = auVar167._4_4_;
                      auVar188._8_4_ = auVar167._12_4_;
                      auVar188._12_4_ = auVar167._8_4_;
                      auVar79 = minps(auVar188,auVar167);
                      auVar146._0_8_ = auVar79._8_8_;
                      auVar146._8_4_ = auVar79._0_4_;
                      auVar146._12_4_ = auVar79._4_4_;
                      auVar79 = minps(auVar146,auVar79);
                      auVar147._0_8_ =
                           CONCAT44(-(uint)(auVar79._4_4_ == auVar167._4_4_) & local_3d8._4_4_,
                                    -(uint)(auVar79._0_4_ == auVar167._0_4_) & local_3d8._0_4_);
                      auVar147._8_4_ = -(uint)(auVar79._8_4_ == auVar167._8_4_) & local_3d8._8_4_;
                      auVar147._12_4_ =
                           -(uint)(auVar79._12_4_ == auVar167._12_4_) & local_3d8._12_4_;
                      iVar55 = movmskps(iVar55,auVar147);
                      auVar108 = local_3d8;
                      if (iVar55 != 0) {
                        auVar108._8_4_ = auVar147._8_4_;
                        auVar108._0_8_ = auVar147._0_8_;
                        auVar108._12_4_ = auVar147._12_4_;
                      }
                      uVar56 = movmskps(iVar55,auVar108);
                      uVar61 = CONCAT44((int)((ulong)pRVar59 >> 0x20),uVar56);
                      lVar67 = 0;
                      if (uVar61 != 0) {
                        for (; (uVar61 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar56 = SUB84(pRVar62,0);
          lVar66 = lVar66 + 4;
        } while ((int)lVar66 < iVar21);
      }
      fVar171 = *(float *)(ray + k * 4 + 0x80);
      auVar139._4_4_ = -(uint)(fStack_44 <= fVar171);
      auVar139._0_4_ = -(uint)(local_48 <= fVar171);
      auVar139._8_4_ = -(uint)(fStack_40 <= fVar171);
      auVar139._12_4_ = -(uint)(fStack_3c <= fVar171);
      uVar69 = movmskps(uVar56,auVar139);
      uVar68 = uVar68 & uVar68 + 0xf & uVar69;
    } while (uVar68 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }